

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [12];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  byte bVar59;
  byte bVar60;
  byte bVar61;
  ulong uVar62;
  uint uVar63;
  ulong uVar64;
  byte bVar65;
  byte bVar66;
  byte bVar67;
  byte bVar68;
  int iVar69;
  long lVar70;
  long lVar71;
  undefined1 uVar72;
  bool bVar73;
  undefined1 uVar74;
  ulong uVar75;
  uint uVar76;
  uint uVar149;
  uint uVar150;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  uint uVar152;
  uint uVar153;
  uint uVar154;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  uint uVar151;
  uint uVar155;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar156;
  float fVar157;
  float fVar179;
  float fVar181;
  vint4 bi_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar180;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar186;
  vint4 bi_1;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar208;
  float fVar209;
  float fVar229;
  float fVar230;
  vint4 bi;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar231;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  float fVar254;
  vint4 ai_2;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  vint4 ai_1;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar260;
  undefined1 auVar259 [64];
  vint4 ai;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar266 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [64];
  float fVar277;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar278 [64];
  float fVar283;
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  undefined1 auVar286 [16];
  float fVar288;
  undefined1 auVar287 [32];
  undefined1 auVar289 [64];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_a91;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  RTCFilterFunctionNArguments local_7d0;
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  Primitive *local_5b0;
  ulong local_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  RTCHitN local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  undefined4 uStack_37c;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  int aiStack_138 [66];
  undefined1 auVar144 [32];
  undefined1 auVar292 [64];
  
  PVar3 = prim[1];
  uVar75 = (ulong)(byte)PVar3;
  lVar71 = uVar75 * 0x25;
  fVar277 = *(float *)(prim + lVar71 + 0x12);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar81 = vsubps_avx(auVar81,*(undefined1 (*) [16])(prim + lVar71 + 6));
  auVar232._0_4_ = fVar277 * auVar81._0_4_;
  auVar232._4_4_ = fVar277 * auVar81._4_4_;
  auVar232._8_4_ = fVar277 * auVar81._8_4_;
  auVar232._12_4_ = fVar277 * auVar81._12_4_;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 4 + 6)));
  auVar158._0_4_ = fVar277 * auVar80._0_4_;
  auVar158._4_4_ = fVar277 * auVar80._4_4_;
  auVar158._8_4_ = fVar277 * auVar80._8_4_;
  auVar158._12_4_ = fVar277 * auVar80._12_4_;
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 5 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 6 + 6)));
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0xf + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar3 * 0x10 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar75 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0x1a + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0x1b + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0x1c + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar255._4_4_ = auVar158._0_4_;
  auVar255._0_4_ = auVar158._0_4_;
  auVar255._8_4_ = auVar158._0_4_;
  auVar255._12_4_ = auVar158._0_4_;
  auVar88 = vshufps_avx(auVar158,auVar158,0x55);
  auVar89 = vshufps_avx(auVar158,auVar158,0xaa);
  fVar277 = auVar89._0_4_;
  auVar210._0_4_ = fVar277 * auVar83._0_4_;
  fVar179 = auVar89._4_4_;
  auVar210._4_4_ = fVar179 * auVar83._4_4_;
  fVar279 = auVar89._8_4_;
  auVar210._8_4_ = fVar279 * auVar83._8_4_;
  fVar280 = auVar89._12_4_;
  auVar210._12_4_ = fVar280 * auVar83._12_4_;
  auVar187._0_4_ = auVar85._0_4_ * fVar277;
  auVar187._4_4_ = auVar85._4_4_ * fVar179;
  auVar187._8_4_ = auVar85._8_4_ * fVar279;
  auVar187._12_4_ = auVar85._12_4_ * fVar280;
  auVar159._0_4_ = auVar86._0_4_ * fVar277;
  auVar159._4_4_ = auVar86._4_4_ * fVar179;
  auVar159._8_4_ = auVar86._8_4_ * fVar279;
  auVar159._12_4_ = auVar86._12_4_ * fVar280;
  auVar89 = vfmadd231ps_fma(auVar210,auVar88,auVar80);
  auVar90 = vfmadd231ps_fma(auVar187,auVar88,auVar16);
  auVar88 = vfmadd231ps_fma(auVar159,auVar82,auVar88);
  auVar22 = vfmadd231ps_fma(auVar89,auVar255,auVar81);
  auVar90 = vfmadd231ps_fma(auVar90,auVar255,auVar84);
  auVar23 = vfmadd231ps_fma(auVar88,auVar87,auVar255);
  auVar293._4_4_ = auVar232._0_4_;
  auVar293._0_4_ = auVar232._0_4_;
  auVar293._8_4_ = auVar232._0_4_;
  auVar293._12_4_ = auVar232._0_4_;
  auVar88 = vshufps_avx(auVar232,auVar232,0x55);
  auVar89 = vshufps_avx(auVar232,auVar232,0xaa);
  fVar277 = auVar89._0_4_;
  auVar256._0_4_ = fVar277 * auVar83._0_4_;
  fVar179 = auVar89._4_4_;
  auVar256._4_4_ = fVar179 * auVar83._4_4_;
  fVar279 = auVar89._8_4_;
  auVar256._8_4_ = fVar279 * auVar83._8_4_;
  fVar280 = auVar89._12_4_;
  auVar256._12_4_ = fVar280 * auVar83._12_4_;
  auVar246._0_4_ = auVar85._0_4_ * fVar277;
  auVar246._4_4_ = auVar85._4_4_ * fVar179;
  auVar246._8_4_ = auVar85._8_4_ * fVar279;
  auVar246._12_4_ = auVar85._12_4_ * fVar280;
  auVar233._0_4_ = auVar86._0_4_ * fVar277;
  auVar233._4_4_ = auVar86._4_4_ * fVar179;
  auVar233._8_4_ = auVar86._8_4_ * fVar279;
  auVar233._12_4_ = auVar86._12_4_ * fVar280;
  auVar80 = vfmadd231ps_fma(auVar256,auVar88,auVar80);
  auVar83 = vfmadd231ps_fma(auVar246,auVar88,auVar16);
  auVar16 = vfmadd231ps_fma(auVar233,auVar88,auVar82);
  auVar24 = vfmadd231ps_fma(auVar80,auVar293,auVar81);
  auVar158 = vfmadd231ps_fma(auVar83,auVar293,auVar84);
  auVar274._8_4_ = 0x7fffffff;
  auVar274._0_8_ = 0x7fffffff7fffffff;
  auVar274._12_4_ = 0x7fffffff;
  auVar159 = vfmadd231ps_fma(auVar16,auVar293,auVar87);
  auVar81 = vandps_avx(auVar274,auVar22);
  auVar270._8_4_ = 0x219392ef;
  auVar270._0_8_ = 0x219392ef219392ef;
  auVar270._12_4_ = 0x219392ef;
  uVar62 = vcmpps_avx512vl(auVar81,auVar270,1);
  bVar73 = (bool)((byte)uVar62 & 1);
  auVar77._0_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar22._0_4_;
  bVar73 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar22._4_4_;
  bVar73 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar22._8_4_;
  bVar73 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar22._12_4_;
  auVar81 = vandps_avx(auVar274,auVar90);
  uVar62 = vcmpps_avx512vl(auVar81,auVar270,1);
  bVar73 = (bool)((byte)uVar62 & 1);
  auVar78._0_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar90._0_4_;
  bVar73 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar90._4_4_;
  bVar73 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar90._8_4_;
  bVar73 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar90._12_4_;
  auVar81 = vandps_avx(auVar274,auVar23);
  uVar62 = vcmpps_avx512vl(auVar81,auVar270,1);
  bVar73 = (bool)((byte)uVar62 & 1);
  auVar79._0_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar23._0_4_;
  bVar73 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar23._4_4_;
  bVar73 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar23._8_4_;
  bVar73 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar73 * 0x219392ef | (uint)!bVar73 * auVar23._12_4_;
  auVar80 = vrcp14ps_avx512vl(auVar77);
  auVar271._8_4_ = 0x3f800000;
  auVar271._0_8_ = &DAT_3f8000003f800000;
  auVar271._12_4_ = 0x3f800000;
  auVar81 = vfnmadd213ps_fma(auVar77,auVar80,auVar271);
  auVar22 = vfmadd132ps_fma(auVar81,auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar78);
  auVar81 = vfnmadd213ps_fma(auVar78,auVar80,auVar271);
  auVar23 = vfmadd132ps_fma(auVar81,auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar79);
  auVar81 = vfnmadd213ps_fma(auVar79,auVar80,auVar271);
  auVar21 = vfmadd132ps_fma(auVar81,auVar80,auVar80);
  fVar277 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar71 + 0x16)) *
            *(float *)(prim + lVar71 + 0x1a);
  auVar261._4_4_ = fVar277;
  auVar261._0_4_ = fVar277;
  auVar261._8_4_ = fVar277;
  auVar261._12_4_ = fVar277;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar75 * 7 + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar75 * 0xb + 6);
  auVar80 = vpmovsxwd_avx(auVar80);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar84 = vsubps_avx(auVar80,auVar81);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar75 * 9 + 6);
  auVar80 = vpmovsxwd_avx(auVar83);
  auVar83 = vfmadd213ps_fma(auVar84,auVar261,auVar81);
  auVar81 = vcvtdq2ps_avx(auVar80);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar75 * 0xd + 6);
  auVar80 = vpmovsxwd_avx(auVar84);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar84 = vfmadd213ps_fma(auVar80,auVar261,auVar81);
  auVar278 = ZEXT1664(auVar84);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar75 * 0x12 + 6);
  auVar81 = vpmovsxwd_avx(auVar16);
  auVar81 = vcvtdq2ps_avx(auVar81);
  uVar62 = (ulong)(uint)((int)(uVar75 * 5) << 2);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar75 * 2 + uVar62 + 6);
  auVar80 = vpmovsxwd_avx(auVar85);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar16 = vfmadd213ps_fma(auVar80,auVar261,auVar81);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar62 + 6);
  auVar81 = vpmovsxwd_avx(auVar87);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar75 * 0x18 + 6);
  auVar80 = vpmovsxwd_avx(auVar82);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar85 = vfmadd213ps_fma(auVar80,auVar261,auVar81);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar75 * 0x1d + 6);
  auVar81 = vpmovsxwd_avx(auVar86);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar75 + (ulong)(byte)PVar3 * 0x20 + 6);
  auVar80 = vpmovsxwd_avx(auVar88);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar87 = vfmadd213ps_fma(auVar80,auVar261,auVar81);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar3 * 0x20 - uVar75) + 6);
  auVar81 = vpmovsxwd_avx(auVar89);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar75 * 0x23 + 6);
  auVar80 = vpmovsxwd_avx(auVar90);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar80 = vfmadd213ps_fma(auVar80,auVar261,auVar81);
  auVar81 = vsubps_avx(auVar83,auVar24);
  auVar262._0_4_ = auVar22._0_4_ * auVar81._0_4_;
  auVar262._4_4_ = auVar22._4_4_ * auVar81._4_4_;
  auVar262._8_4_ = auVar22._8_4_ * auVar81._8_4_;
  auVar262._12_4_ = auVar22._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar84,auVar24);
  auVar211._0_4_ = auVar22._0_4_ * auVar81._0_4_;
  auVar211._4_4_ = auVar22._4_4_ * auVar81._4_4_;
  auVar211._8_4_ = auVar22._8_4_ * auVar81._8_4_;
  auVar211._12_4_ = auVar22._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar16,auVar158);
  auVar257._0_4_ = auVar23._0_4_ * auVar81._0_4_;
  auVar257._4_4_ = auVar23._4_4_ * auVar81._4_4_;
  auVar257._8_4_ = auVar23._8_4_ * auVar81._8_4_;
  auVar257._12_4_ = auVar23._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar85,auVar158);
  auVar188._0_4_ = auVar23._0_4_ * auVar81._0_4_;
  auVar188._4_4_ = auVar23._4_4_ * auVar81._4_4_;
  auVar188._8_4_ = auVar23._8_4_ * auVar81._8_4_;
  auVar188._12_4_ = auVar23._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar87,auVar159);
  auVar247._0_4_ = auVar21._0_4_ * auVar81._0_4_;
  auVar247._4_4_ = auVar21._4_4_ * auVar81._4_4_;
  auVar247._8_4_ = auVar21._8_4_ * auVar81._8_4_;
  auVar247._12_4_ = auVar21._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar80,auVar159);
  auVar160._0_4_ = auVar21._0_4_ * auVar81._0_4_;
  auVar160._4_4_ = auVar21._4_4_ * auVar81._4_4_;
  auVar160._8_4_ = auVar21._8_4_ * auVar81._8_4_;
  auVar160._12_4_ = auVar21._12_4_ * auVar81._12_4_;
  auVar81 = vpminsd_avx(auVar262,auVar211);
  auVar80 = vpminsd_avx(auVar257,auVar188);
  auVar81 = vmaxps_avx(auVar81,auVar80);
  auVar80 = vpminsd_avx(auVar247,auVar160);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar22._4_4_ = uVar2;
  auVar22._0_4_ = uVar2;
  auVar22._8_4_ = uVar2;
  auVar22._12_4_ = uVar2;
  auVar80 = vmaxps_avx512vl(auVar80,auVar22);
  auVar81 = vmaxps_avx(auVar81,auVar80);
  auVar23._8_4_ = 0x3f7ffffa;
  auVar23._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar23._12_4_ = 0x3f7ffffa;
  local_470 = vmulps_avx512vl(auVar81,auVar23);
  auVar81 = vpmaxsd_avx(auVar262,auVar211);
  auVar80 = vpmaxsd_avx(auVar257,auVar188);
  auVar81 = vminps_avx(auVar81,auVar80);
  auVar80 = vpmaxsd_avx(auVar247,auVar160);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar21._4_4_ = uVar2;
  auVar21._0_4_ = uVar2;
  auVar21._8_4_ = uVar2;
  auVar21._12_4_ = uVar2;
  auVar80 = vminps_avx512vl(auVar80,auVar21);
  auVar81 = vminps_avx(auVar81,auVar80);
  auVar24._8_4_ = 0x3f800003;
  auVar24._0_8_ = 0x3f8000033f800003;
  auVar24._12_4_ = 0x3f800003;
  auVar81 = vmulps_avx512vl(auVar81,auVar24);
  auVar80 = vpbroadcastd_avx512vl();
  uVar17 = vcmpps_avx512vl(local_470,auVar81,2);
  local_5a8 = vpcmpgtd_avx512vl(auVar80,_DAT_01ff0cf0);
  local_5a8 = ((byte)uVar17 & 0xf) & local_5a8;
  bVar73 = (char)local_5a8 == '\0';
  local_a91 = !bVar73;
  if (bVar73) {
    return local_a91;
  }
  local_460 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5b0 = prim;
LAB_01c3b5ac:
  lVar71 = 0;
  for (uVar62 = local_5a8; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
    lVar71 = lVar71 + 1;
  }
  uVar63 = *(uint *)(local_5b0 + 2);
  pGVar4 = (context->scene->geometries).items[uVar63].ptr;
  uVar62 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)*(uint *)(local_5b0 + lVar71 * 4 + 6) *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar277 = (pGVar4->time_range).lower;
  fVar277 = pGVar4->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar277) / ((pGVar4->time_range).upper - fVar277));
  auVar81 = vroundss_avx(ZEXT416((uint)fVar277),ZEXT416((uint)fVar277),9);
  auVar81 = vminss_avx(auVar81,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar81 = vmaxss_avx(ZEXT816(0) << 0x20,auVar81);
  fVar277 = fVar277 - auVar81._0_4_;
  _Var5 = pGVar4[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar70 = (long)(int)auVar81._0_4_ * 0x38;
  lVar71 = *(long *)(_Var5 + 0x10 + lVar70);
  lVar6 = *(long *)(_Var5 + 0x38 + lVar70);
  lVar7 = *(long *)(_Var5 + 0x48 + lVar70);
  pfVar1 = (float *)(lVar6 + uVar62 * lVar7);
  auVar161._0_4_ = fVar277 * *pfVar1;
  auVar161._4_4_ = fVar277 * pfVar1[1];
  auVar161._8_4_ = fVar277 * pfVar1[2];
  auVar161._12_4_ = fVar277 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar62 + 1) * lVar7);
  auVar189._0_4_ = fVar277 * *pfVar1;
  auVar189._4_4_ = fVar277 * pfVar1[1];
  auVar189._8_4_ = fVar277 * pfVar1[2];
  auVar189._12_4_ = fVar277 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar62 + 2) * lVar7);
  auVar212._0_4_ = fVar277 * *pfVar1;
  auVar212._4_4_ = fVar277 * pfVar1[1];
  auVar212._8_4_ = fVar277 * pfVar1[2];
  auVar212._12_4_ = fVar277 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + lVar7 * (uVar62 + 3));
  auVar234._0_4_ = fVar277 * *pfVar1;
  auVar234._4_4_ = fVar277 * pfVar1[1];
  auVar234._8_4_ = fVar277 * pfVar1[2];
  auVar234._12_4_ = fVar277 * pfVar1[3];
  lVar6 = *(long *)(_Var5 + lVar70);
  fVar277 = 1.0 - fVar277;
  auVar248._4_4_ = fVar277;
  auVar248._0_4_ = fVar277;
  auVar248._8_4_ = fVar277;
  auVar248._12_4_ = fVar277;
  auVar83 = vfmadd231ps_fma(auVar161,auVar248,*(undefined1 (*) [16])(lVar6 + lVar71 * uVar62));
  auVar84 = vfmadd231ps_fma(auVar189,auVar248,*(undefined1 (*) [16])(lVar6 + lVar71 * (uVar62 + 1)))
  ;
  auVar16 = vfmadd231ps_fma(auVar212,auVar248,*(undefined1 (*) [16])(lVar6 + lVar71 * (uVar62 + 2)))
  ;
  auVar85 = vfmadd231ps_fma(auVar234,auVar248,*(undefined1 (*) [16])(lVar6 + lVar71 * (uVar62 + 3)))
  ;
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar80 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar290._4_4_ = uVar2;
  auVar290._0_4_ = uVar2;
  auVar290._8_4_ = uVar2;
  auVar290._12_4_ = uVar2;
  local_520._16_4_ = uVar2;
  local_520._0_16_ = auVar290;
  local_520._20_4_ = uVar2;
  local_520._24_4_ = uVar2;
  local_520._28_4_ = uVar2;
  auVar292 = ZEXT3264(local_520);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar294._4_4_ = uVar2;
  auVar294._0_4_ = uVar2;
  auVar294._8_4_ = uVar2;
  auVar294._12_4_ = uVar2;
  local_540._16_4_ = uVar2;
  local_540._0_16_ = auVar294;
  local_540._20_4_ = uVar2;
  local_540._24_4_ = uVar2;
  local_540._28_4_ = uVar2;
  auVar81 = vunpcklps_avx(auVar290,auVar294);
  fVar277 = *(float *)(ray + k * 4 + 0xc0);
  auVar295._4_4_ = fVar277;
  auVar295._0_4_ = fVar277;
  auVar295._8_4_ = fVar277;
  auVar295._12_4_ = fVar277;
  local_560._16_4_ = fVar277;
  local_560._0_16_ = auVar295;
  local_560._20_4_ = fVar277;
  local_560._24_4_ = fVar277;
  local_560._28_4_ = fVar277;
  local_710 = vinsertps_avx(auVar81,auVar295,0x28);
  auVar284 = ZEXT1664(local_710);
  auVar258._0_4_ = auVar83._0_4_ + auVar84._0_4_ + auVar16._0_4_ + auVar85._0_4_;
  auVar258._4_4_ = auVar83._4_4_ + auVar84._4_4_ + auVar16._4_4_ + auVar85._4_4_;
  auVar258._8_4_ = auVar83._8_4_ + auVar84._8_4_ + auVar16._8_4_ + auVar85._8_4_;
  auVar258._12_4_ = auVar83._12_4_ + auVar84._12_4_ + auVar16._12_4_ + auVar85._12_4_;
  auVar25._8_4_ = 0x3e800000;
  auVar25._0_8_ = 0x3e8000003e800000;
  auVar25._12_4_ = 0x3e800000;
  auVar81 = vmulps_avx512vl(auVar258,auVar25);
  auVar81 = vsubps_avx(auVar81,auVar80);
  auVar81 = vdpps_avx(auVar81,local_710,0x7f);
  fVar179 = *(float *)(ray + k * 4 + 0x60);
  local_720 = vdpps_avx(local_710,local_710,0x7f);
  auVar289 = ZEXT1664(local_720);
  local_420 = vpbroadcastd_avx512vl();
  auVar263._4_12_ = ZEXT812(0) << 0x20;
  auVar263._0_4_ = local_720._0_4_;
  auVar82 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar263);
  auVar87 = vfnmadd213ss_fma(auVar82,local_720,ZEXT416(0x40000000));
  local_200 = auVar81._0_4_ * auVar82._0_4_ * auVar87._0_4_;
  auVar259 = ZEXT464((uint)local_200);
  auVar264._4_4_ = local_200;
  auVar264._0_4_ = local_200;
  auVar264._8_4_ = local_200;
  auVar264._12_4_ = local_200;
  fStack_770 = local_200;
  _local_780 = auVar264;
  fStack_76c = local_200;
  fStack_768 = local_200;
  fStack_764 = local_200;
  auVar81 = vfmadd231ps_fma(auVar80,local_710,auVar264);
  auVar81 = vblendps_avx(auVar81,ZEXT816(0) << 0x40,8);
  auVar80 = vsubps_avx(auVar83,auVar81);
  auVar83 = vsubps_avx(auVar16,auVar81);
  auVar84 = vsubps_avx(auVar84,auVar81);
  auVar276 = ZEXT1664(auVar84);
  auVar81 = vsubps_avx(auVar85,auVar81);
  auVar245 = ZEXT3264(_DAT_02020f20);
  auVar91 = vbroadcastss_avx512vl(auVar80);
  auVar103._8_4_ = 1;
  auVar103._0_8_ = 0x100000001;
  auVar103._12_4_ = 1;
  auVar103._16_4_ = 1;
  auVar103._20_4_ = 1;
  auVar103._24_4_ = 1;
  auVar103._28_4_ = 1;
  local_6a0 = ZEXT1632(auVar80);
  auVar92 = vpermps_avx512vl(auVar103,local_6a0);
  auVar104._8_4_ = 2;
  auVar104._0_8_ = 0x200000002;
  auVar104._12_4_ = 2;
  auVar104._16_4_ = 2;
  auVar104._20_4_ = 2;
  auVar104._24_4_ = 2;
  auVar104._28_4_ = 2;
  auVar93 = vpermps_avx512vl(auVar104,local_6a0);
  auVar105._8_4_ = 3;
  auVar105._0_8_ = 0x300000003;
  auVar105._12_4_ = 3;
  auVar105._16_4_ = 3;
  auVar105._20_4_ = 3;
  auVar105._24_4_ = 3;
  auVar105._28_4_ = 3;
  auVar94 = vpermps_avx512vl(auVar105,local_6a0);
  auVar95 = vbroadcastss_avx512vl(auVar84);
  local_6e0 = ZEXT1632(auVar84);
  auVar96 = vpermps_avx512vl(auVar103,local_6e0);
  auVar97 = vpermps_avx512vl(auVar104,local_6e0);
  auVar98 = vpermps_avx512vl(auVar105,local_6e0);
  auVar99 = vbroadcastss_avx512vl(auVar83);
  local_6c0 = ZEXT1632(auVar83);
  auVar100 = vpermps_avx512vl(auVar103,local_6c0);
  auVar101 = vpermps_avx512vl(auVar104,local_6c0);
  auVar102 = vpermps_avx512vl(auVar105,local_6c0);
  local_7a0 = vbroadcastss_avx512vl(auVar81);
  auVar297 = ZEXT3264(local_7a0);
  _local_700 = ZEXT1632(auVar81);
  auVar103 = vpermps_avx512vl(auVar103,_local_700);
  local_3e0 = vpermps_avx512vl(auVar104,_local_700);
  local_240 = vpermps_avx2(auVar105,_local_700);
  auVar228 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  auVar81 = vfmadd231ps_fma(ZEXT432((uint)(fVar277 * fVar277)),local_540,local_540);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_520,local_520);
  local_1e0._0_4_ = auVar81._0_4_;
  local_1e0._4_4_ = local_1e0._0_4_;
  local_1e0._8_4_ = local_1e0._0_4_;
  local_1e0._12_4_ = local_1e0._0_4_;
  local_1e0._16_4_ = local_1e0._0_4_;
  local_1e0._20_4_ = local_1e0._0_4_;
  local_1e0._24_4_ = local_1e0._0_4_;
  local_1e0._28_4_ = local_1e0._0_4_;
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_1e0,auVar112);
  local_630 = ZEXT416((uint)local_200);
  local_200 = fVar179 - local_200;
  fStack_1fc = local_200;
  fStack_1f8 = local_200;
  fStack_1f4 = local_200;
  fStack_1f0 = local_200;
  fStack_1ec = local_200;
  fStack_1e8 = local_200;
  fStack_1e4 = local_200;
  bVar67 = 0;
  iVar69 = 1;
  local_440 = vpbroadcastd_avx512vl();
  auVar81 = vsqrtss_avx(local_720,local_720);
  auVar80 = vsqrtss_avx(local_720,local_720);
  local_650 = ZEXT816(0x3f80000000000000);
  local_220 = local_3e0;
  uVar62 = 0;
  do {
    auVar83 = vmovshdup_avx(local_650);
    fVar186 = local_650._0_4_;
    fVar288 = auVar83._0_4_ - fVar186;
    fVar269 = fVar288 * 0.04761905;
    auVar251._4_4_ = fVar186;
    auVar251._0_4_ = fVar186;
    auVar251._8_4_ = fVar186;
    auVar251._12_4_ = fVar186;
    auVar251._16_4_ = fVar186;
    auVar251._20_4_ = fVar186;
    auVar251._24_4_ = fVar186;
    auVar251._28_4_ = fVar186;
    local_740._4_4_ = fVar288;
    local_740._0_4_ = fVar288;
    local_740._8_4_ = fVar288;
    local_740._12_4_ = fVar288;
    local_740._16_4_ = fVar288;
    local_740._20_4_ = fVar288;
    local_740._24_4_ = fVar288;
    local_740._28_4_ = fVar288;
    auVar83 = vfmadd231ps_fma(auVar251,local_740,auVar245._0_32_);
    auVar112 = vsubps_avx(auVar228._0_32_,ZEXT1632(auVar83));
    fVar277 = auVar112._0_4_;
    fVar280 = auVar112._4_4_;
    fVar267 = auVar112._8_4_;
    fVar282 = auVar112._12_4_;
    fVar283 = auVar112._16_4_;
    fVar254 = auVar112._20_4_;
    fVar209 = auVar112._24_4_;
    fVar156 = fVar277 * fVar277 * fVar277;
    fVar180 = fVar280 * fVar280 * fVar280;
    auVar107._4_4_ = fVar180;
    auVar107._0_4_ = fVar156;
    fVar181 = fVar267 * fVar267 * fVar267;
    auVar107._8_4_ = fVar181;
    fVar182 = fVar282 * fVar282 * fVar282;
    auVar107._12_4_ = fVar182;
    fVar183 = fVar283 * fVar283 * fVar283;
    auVar107._16_4_ = fVar183;
    fVar184 = fVar254 * fVar254 * fVar254;
    auVar107._20_4_ = fVar184;
    fVar185 = fVar209 * fVar209 * fVar209;
    auVar107._24_4_ = fVar185;
    auVar107._28_4_ = fVar288;
    auVar104 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar105 = vmulps_avx512vl(auVar107,auVar104);
    fVar279 = auVar83._0_4_;
    fVar281 = auVar83._4_4_;
    fVar268 = auVar83._8_4_;
    fVar157 = auVar83._12_4_;
    fVar208 = fVar279 * fVar279 * fVar279;
    fVar229 = fVar281 * fVar281 * fVar281;
    fVar230 = fVar268 * fVar268 * fVar268;
    fVar231 = fVar157 * fVar157 * fVar157;
    auVar228._0_28_ = ZEXT1628(CONCAT412(fVar231,CONCAT48(fVar230,CONCAT44(fVar229,fVar208))));
    auVar285._0_4_ = fVar279 * fVar277;
    auVar285._4_4_ = fVar281 * fVar280;
    auVar285._8_4_ = fVar268 * fVar267;
    auVar285._12_4_ = fVar157 * fVar282;
    auVar285._16_4_ = fVar283 * 0.0;
    auVar285._20_4_ = fVar254 * 0.0;
    auVar285._28_36_ = auVar284._28_36_;
    auVar285._24_4_ = fVar209 * 0.0;
    auVar104 = vmulps_avx512vl(auVar228._0_32_,auVar104);
    fVar288 = auVar104._28_4_ + fVar288;
    fVar260 = fVar288 + auVar289._28_4_ + auVar259._28_4_;
    auVar113._4_4_ = fVar180 * 0.16666667;
    auVar113._0_4_ = fVar156 * 0.16666667;
    auVar113._8_4_ = fVar181 * 0.16666667;
    auVar113._12_4_ = fVar182 * 0.16666667;
    auVar113._16_4_ = fVar183 * 0.16666667;
    auVar113._20_4_ = fVar184 * 0.16666667;
    auVar113._24_4_ = fVar185 * 0.16666667;
    auVar113._28_4_ = fVar288;
    auVar108._4_4_ =
         (auVar285._4_4_ * fVar280 * 12.0 + auVar285._4_4_ * fVar281 * 6.0 +
         fVar229 + auVar105._4_4_) * 0.16666667;
    auVar108._0_4_ =
         (auVar285._0_4_ * fVar277 * 12.0 + auVar285._0_4_ * fVar279 * 6.0 +
         fVar208 + auVar105._0_4_) * 0.16666667;
    auVar108._8_4_ =
         (auVar285._8_4_ * fVar267 * 12.0 + auVar285._8_4_ * fVar268 * 6.0 +
         fVar230 + auVar105._8_4_) * 0.16666667;
    auVar108._12_4_ =
         (auVar285._12_4_ * fVar282 * 12.0 + auVar285._12_4_ * fVar157 * 6.0 +
         fVar231 + auVar105._12_4_) * 0.16666667;
    auVar108._16_4_ =
         (auVar285._16_4_ * fVar283 * 12.0 + auVar285._16_4_ * 0.0 * 6.0 + auVar105._16_4_ + 0.0) *
         0.16666667;
    auVar108._20_4_ =
         (auVar285._20_4_ * fVar254 * 12.0 + auVar285._20_4_ * 0.0 * 6.0 + auVar105._20_4_ + 0.0) *
         0.16666667;
    auVar108._24_4_ =
         (auVar285._24_4_ * fVar209 * 12.0 + auVar285._24_4_ * 0.0 * 6.0 + auVar105._24_4_ + 0.0) *
         0.16666667;
    auVar108._28_4_ = auVar289._28_4_;
    auVar109._4_4_ =
         (auVar104._4_4_ + fVar180 +
         auVar285._4_4_ * fVar281 * 12.0 + auVar285._4_4_ * fVar280 * 6.0) * 0.16666667;
    auVar109._0_4_ =
         (auVar104._0_4_ + fVar156 +
         auVar285._0_4_ * fVar279 * 12.0 + auVar285._0_4_ * fVar277 * 6.0) * 0.16666667;
    auVar109._8_4_ =
         (auVar104._8_4_ + fVar181 +
         auVar285._8_4_ * fVar268 * 12.0 + auVar285._8_4_ * fVar267 * 6.0) * 0.16666667;
    auVar109._12_4_ =
         (auVar104._12_4_ + fVar182 +
         auVar285._12_4_ * fVar157 * 12.0 + auVar285._12_4_ * fVar282 * 6.0) * 0.16666667;
    auVar109._16_4_ =
         (auVar104._16_4_ + fVar183 + auVar285._16_4_ * 0.0 * 12.0 + auVar285._16_4_ * fVar283 * 6.0
         ) * 0.16666667;
    auVar109._20_4_ =
         (auVar104._20_4_ + fVar184 + auVar285._20_4_ * 0.0 * 12.0 + auVar285._20_4_ * fVar254 * 6.0
         ) * 0.16666667;
    auVar109._24_4_ =
         (auVar104._24_4_ + fVar185 + auVar285._24_4_ * 0.0 * 12.0 + auVar285._24_4_ * fVar209 * 6.0
         ) * 0.16666667;
    auVar109._28_4_ = auVar292._28_4_;
    auVar110._28_4_ = fVar260;
    auVar110._0_28_ =
         ZEXT1628(CONCAT412(fVar231 * 0.16666667,
                            CONCAT48(fVar230 * 0.16666667,
                                     CONCAT44(fVar229 * 0.16666667,fVar208 * 0.16666667))));
    auVar104 = vmulps_avx512vl(auVar297._0_32_,auVar110);
    auVar105 = vmulps_avx512vl(auVar103,auVar110);
    auVar106 = vmulps_avx512vl(local_220,auVar110);
    auVar115._4_4_ = local_240._4_4_ * fVar229 * 0.16666667;
    auVar115._0_4_ = local_240._0_4_ * fVar208 * 0.16666667;
    auVar115._8_4_ = local_240._8_4_ * fVar230 * 0.16666667;
    auVar115._12_4_ = local_240._12_4_ * fVar231 * 0.16666667;
    auVar115._16_4_ = local_240._16_4_ * 0.0;
    auVar115._20_4_ = local_240._20_4_ * 0.0;
    auVar115._24_4_ = local_240._24_4_ * 0.0;
    auVar115._28_4_ = fVar260;
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar109,auVar99);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar109,auVar100);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar109,auVar101);
    auVar107 = vfmadd231ps_avx512vl(auVar115,auVar102,auVar109);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar108,auVar95);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar108,auVar96);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar97);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar98,auVar108);
    auVar108 = vfmadd231ps_avx512vl(auVar104,auVar113,auVar91);
    auVar109 = vfmadd231ps_avx512vl(auVar105,auVar113,auVar92);
    auVar110 = vfmadd231ps_avx512vl(auVar106,auVar113,auVar93);
    auVar105 = vfmadd231ps_avx512vl(auVar107,auVar94,auVar113);
    auVar104 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar107 = vxorps_avx512vl(auVar112,auVar104);
    auVar111 = vxorps_avx512vl(ZEXT1632(auVar83),auVar104);
    auVar129._0_4_ = auVar111._0_4_ * fVar279;
    auVar129._4_4_ = auVar111._4_4_ * fVar281;
    auVar129._8_4_ = auVar111._8_4_ * fVar268;
    auVar129._12_4_ = auVar111._12_4_ * fVar157;
    auVar129._16_4_ = auVar111._16_4_ * 0.0;
    auVar129._20_4_ = auVar111._20_4_ * 0.0;
    auVar129._24_4_ = auVar111._24_4_ * 0.0;
    auVar129._28_4_ = 0;
    auVar106._8_4_ = 0x40800000;
    auVar106._0_8_ = 0x4080000040800000;
    auVar106._12_4_ = 0x40800000;
    auVar106._16_4_ = 0x40800000;
    auVar106._20_4_ = 0x40800000;
    auVar106._24_4_ = 0x40800000;
    auVar106._28_4_ = 0x40800000;
    auVar106 = vmulps_avx512vl(auVar285._0_32_,auVar106);
    auVar104 = vsubps_avx(auVar129,auVar106);
    auVar116._4_4_ = auVar107._4_4_ * fVar280 * 0.5;
    auVar116._0_4_ = auVar107._0_4_ * fVar277 * 0.5;
    auVar116._8_4_ = auVar107._8_4_ * fVar267 * 0.5;
    auVar116._12_4_ = auVar107._12_4_ * fVar282 * 0.5;
    auVar116._16_4_ = auVar107._16_4_ * fVar283 * 0.5;
    auVar116._20_4_ = auVar107._20_4_ * fVar254 * 0.5;
    auVar116._24_4_ = auVar107._24_4_ * fVar209 * 0.5;
    auVar116._28_4_ = auVar112._28_4_;
    auVar117._4_4_ = auVar104._4_4_ * 0.5;
    auVar117._0_4_ = auVar104._0_4_ * 0.5;
    auVar117._8_4_ = auVar104._8_4_ * 0.5;
    auVar117._12_4_ = auVar104._12_4_ * 0.5;
    auVar117._16_4_ = auVar104._16_4_ * 0.5;
    auVar117._20_4_ = auVar104._20_4_ * 0.5;
    auVar117._24_4_ = auVar104._24_4_ * 0.5;
    auVar117._28_4_ = auVar104._28_4_;
    auVar118._4_4_ = (fVar280 * fVar280 + auVar106._4_4_) * 0.5;
    auVar118._0_4_ = (fVar277 * fVar277 + auVar106._0_4_) * 0.5;
    auVar118._8_4_ = (fVar267 * fVar267 + auVar106._8_4_) * 0.5;
    auVar118._12_4_ = (fVar282 * fVar282 + auVar106._12_4_) * 0.5;
    auVar118._16_4_ = (fVar283 * fVar283 + auVar106._16_4_) * 0.5;
    auVar118._20_4_ = (fVar254 * fVar254 + auVar106._20_4_) * 0.5;
    auVar118._24_4_ = (fVar209 * fVar209 + auVar106._24_4_) * 0.5;
    auVar118._28_4_ = auVar276._28_4_ + auVar106._28_4_;
    fVar277 = fVar279 * fVar279 * 0.5;
    fVar279 = fVar281 * fVar281 * 0.5;
    fVar280 = fVar268 * fVar268 * 0.5;
    fVar281 = fVar157 * fVar157 * 0.5;
    auVar123._28_4_ = auVar278._28_4_;
    auVar123._0_28_ = ZEXT1628(CONCAT412(fVar281,CONCAT48(fVar280,CONCAT44(fVar279,fVar277))));
    auVar112 = vmulps_avx512vl(auVar297._0_32_,auVar123);
    auVar104 = vmulps_avx512vl(auVar103,auVar123);
    auVar106 = vmulps_avx512vl(local_220,auVar123);
    auVar124._4_4_ = fVar279 * local_240._4_4_;
    auVar124._0_4_ = fVar277 * local_240._0_4_;
    auVar124._8_4_ = fVar280 * local_240._8_4_;
    auVar124._12_4_ = fVar281 * local_240._12_4_;
    auVar124._16_4_ = local_240._16_4_ * 0.0;
    auVar124._20_4_ = local_240._20_4_ * 0.0;
    auVar124._24_4_ = local_240._24_4_ * 0.0;
    auVar124._28_4_ = auVar278._28_4_;
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar118,auVar99);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar118,auVar100);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar118,auVar101);
    auVar107 = vfmadd231ps_avx512vl(auVar124,auVar102,auVar118);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar117,auVar95);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar117,auVar96);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar117,auVar97);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar98,auVar117);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar116,auVar91);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar116,auVar92);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar116,auVar93);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar94,auVar116);
    auVar133._4_4_ = auVar112._4_4_ * fVar269;
    auVar133._0_4_ = auVar112._0_4_ * fVar269;
    auVar133._8_4_ = auVar112._8_4_ * fVar269;
    auVar133._12_4_ = auVar112._12_4_ * fVar269;
    auVar133._16_4_ = auVar112._16_4_ * fVar269;
    auVar133._20_4_ = auVar112._20_4_ * fVar269;
    auVar133._24_4_ = auVar112._24_4_ * fVar269;
    auVar133._28_4_ = auVar111._28_4_;
    auVar134._4_4_ = auVar104._4_4_ * fVar269;
    auVar134._0_4_ = auVar104._0_4_ * fVar269;
    auVar134._8_4_ = auVar104._8_4_ * fVar269;
    auVar134._12_4_ = auVar104._12_4_ * fVar269;
    auVar134._16_4_ = auVar104._16_4_ * fVar269;
    auVar134._20_4_ = auVar104._20_4_ * fVar269;
    auVar134._24_4_ = auVar104._24_4_ * fVar269;
    auVar134._28_4_ = auVar104._28_4_;
    auVar289 = ZEXT3264(auVar134);
    auVar135._4_4_ = auVar106._4_4_ * fVar269;
    auVar135._0_4_ = auVar106._0_4_ * fVar269;
    auVar135._8_4_ = auVar106._8_4_ * fVar269;
    auVar135._12_4_ = auVar106._12_4_ * fVar269;
    auVar135._16_4_ = auVar106._16_4_ * fVar269;
    auVar135._20_4_ = auVar106._20_4_ * fVar269;
    auVar135._24_4_ = auVar106._24_4_ * fVar269;
    auVar135._28_4_ = auVar106._28_4_;
    fVar277 = auVar107._0_4_ * fVar269;
    fVar279 = auVar107._4_4_ * fVar269;
    auVar125._4_4_ = fVar279;
    auVar125._0_4_ = fVar277;
    fVar280 = auVar107._8_4_ * fVar269;
    auVar125._8_4_ = fVar280;
    fVar281 = auVar107._12_4_ * fVar269;
    auVar125._12_4_ = fVar281;
    fVar267 = auVar107._16_4_ * fVar269;
    auVar125._16_4_ = fVar267;
    fVar268 = auVar107._20_4_ * fVar269;
    auVar125._20_4_ = fVar268;
    fVar269 = auVar107._24_4_ * fVar269;
    auVar125._24_4_ = fVar269;
    auVar125._28_4_ = local_240._28_4_;
    auVar83 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
    auVar113 = vpermt2ps_avx512vl(auVar108,_DAT_0205fd20,ZEXT1632(auVar83));
    auVar276 = ZEXT3264(auVar113);
    auVar114 = vpermt2ps_avx512vl(auVar109,_DAT_0205fd20,ZEXT1632(auVar83));
    auVar106 = ZEXT1632(auVar83);
    auVar115 = vpermt2ps_avx512vl(auVar110,_DAT_0205fd20,auVar106);
    auVar130._0_4_ = fVar277 + auVar105._0_4_;
    auVar130._4_4_ = fVar279 + auVar105._4_4_;
    auVar130._8_4_ = fVar280 + auVar105._8_4_;
    auVar130._12_4_ = fVar281 + auVar105._12_4_;
    auVar130._16_4_ = fVar267 + auVar105._16_4_;
    auVar130._20_4_ = fVar268 + auVar105._20_4_;
    auVar130._24_4_ = fVar269 + auVar105._24_4_;
    auVar130._28_4_ = local_240._28_4_ + auVar105._28_4_;
    auVar112 = vmaxps_avx(auVar105,auVar130);
    auVar104 = vminps_avx(auVar105,auVar130);
    auVar111 = vpermt2ps_avx512vl(auVar105,_DAT_0205fd20,auVar106);
    auVar116 = vpermt2ps_avx512vl(auVar133,_DAT_0205fd20,auVar106);
    auVar117 = vpermt2ps_avx512vl(auVar134,_DAT_0205fd20,auVar106);
    auVar130 = ZEXT1632(auVar83);
    auVar118 = vpermt2ps_avx512vl(auVar135,_DAT_0205fd20,auVar130);
    auVar105 = vpermt2ps_avx512vl(auVar125,_DAT_0205fd20,auVar130);
    auVar119 = vsubps_avx512vl(auVar111,auVar105);
    auVar105 = vsubps_avx(auVar113,auVar108);
    auVar106 = vsubps_avx(auVar114,auVar109);
    auVar107 = vsubps_avx(auVar115,auVar110);
    auVar259 = ZEXT3264(auVar107);
    auVar120 = vmulps_avx512vl(auVar106,auVar135);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar134,auVar107);
    auVar121 = vmulps_avx512vl(auVar107,auVar133);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar135,auVar105);
    auVar122 = vmulps_avx512vl(auVar105,auVar134);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar133,auVar106);
    auVar122 = vmulps_avx512vl(auVar122,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar121);
    auVar120 = vfmadd231ps_avx512vl(auVar121,auVar120,auVar120);
    auVar121 = vmulps_avx512vl(auVar107,auVar107);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar106,auVar106);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar105,auVar105);
    auVar122 = vrcp14ps_avx512vl(auVar121);
    auVar123 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar124 = vfnmadd213ps_avx512vl(auVar122,auVar121,auVar123);
    auVar122 = vfmadd132ps_avx512vl(auVar124,auVar122,auVar122);
    auVar120 = vmulps_avx512vl(auVar120,auVar122);
    auVar124 = vmulps_avx512vl(auVar106,auVar118);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar117,auVar107);
    auVar125 = vmulps_avx512vl(auVar107,auVar116);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar118,auVar105);
    auVar126 = vmulps_avx512vl(auVar105,auVar117);
    auVar126 = vfmsub231ps_avx512vl(auVar126,auVar116,auVar106);
    auVar126 = vmulps_avx512vl(auVar126,auVar126);
    auVar125 = vfmadd231ps_avx512vl(auVar126,auVar125,auVar125);
    auVar124 = vfmadd231ps_avx512vl(auVar125,auVar124,auVar124);
    auVar122 = vmulps_avx512vl(auVar124,auVar122);
    auVar120 = vmaxps_avx512vl(auVar120,auVar122);
    auVar120 = vsqrtps_avx512vl(auVar120);
    auVar122 = vmaxps_avx512vl(auVar119,auVar111);
    auVar112 = vmaxps_avx512vl(auVar112,auVar122);
    auVar122 = vaddps_avx512vl(auVar120,auVar112);
    auVar112 = vminps_avx512vl(auVar119,auVar111);
    auVar112 = vminps_avx(auVar104,auVar112);
    auVar112 = vsubps_avx512vl(auVar112,auVar120);
    auVar111._8_4_ = 0x3f800002;
    auVar111._0_8_ = 0x3f8000023f800002;
    auVar111._12_4_ = 0x3f800002;
    auVar111._16_4_ = 0x3f800002;
    auVar111._20_4_ = 0x3f800002;
    auVar111._24_4_ = 0x3f800002;
    auVar111._28_4_ = 0x3f800002;
    auVar104 = vmulps_avx512vl(auVar122,auVar111);
    auVar119._8_4_ = 0x3f7ffffc;
    auVar119._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar119._12_4_ = 0x3f7ffffc;
    auVar119._16_4_ = 0x3f7ffffc;
    auVar119._20_4_ = 0x3f7ffffc;
    auVar119._24_4_ = 0x3f7ffffc;
    auVar119._28_4_ = 0x3f7ffffc;
    auVar112 = vmulps_avx512vl(auVar112,auVar119);
    auVar126._4_4_ = auVar104._4_4_ * auVar104._4_4_;
    auVar126._0_4_ = auVar104._0_4_ * auVar104._0_4_;
    auVar126._8_4_ = auVar104._8_4_ * auVar104._8_4_;
    auVar126._12_4_ = auVar104._12_4_ * auVar104._12_4_;
    auVar126._16_4_ = auVar104._16_4_ * auVar104._16_4_;
    auVar126._20_4_ = auVar104._20_4_ * auVar104._20_4_;
    auVar126._24_4_ = auVar104._24_4_ * auVar104._24_4_;
    auVar126._28_4_ = auVar112._28_4_;
    auVar104 = vrsqrt14ps_avx512vl(auVar121);
    auVar120._8_4_ = 0xbf000000;
    auVar120._0_8_ = 0xbf000000bf000000;
    auVar120._12_4_ = 0xbf000000;
    auVar120._16_4_ = 0xbf000000;
    auVar120._20_4_ = 0xbf000000;
    auVar120._24_4_ = 0xbf000000;
    auVar120._28_4_ = 0xbf000000;
    auVar111 = vmulps_avx512vl(auVar121,auVar120);
    auVar127._4_4_ = auVar104._4_4_ * auVar111._4_4_;
    auVar127._0_4_ = auVar104._0_4_ * auVar111._0_4_;
    auVar127._8_4_ = auVar104._8_4_ * auVar111._8_4_;
    auVar127._12_4_ = auVar104._12_4_ * auVar111._12_4_;
    auVar127._16_4_ = auVar104._16_4_ * auVar111._16_4_;
    auVar127._20_4_ = auVar104._20_4_ * auVar111._20_4_;
    auVar127._24_4_ = auVar104._24_4_ * auVar111._24_4_;
    auVar127._28_4_ = auVar111._28_4_;
    auVar111 = vmulps_avx512vl(auVar104,auVar104);
    auVar111 = vmulps_avx512vl(auVar111,auVar127);
    auVar121._8_4_ = 0x3fc00000;
    auVar121._0_8_ = 0x3fc000003fc00000;
    auVar121._12_4_ = 0x3fc00000;
    auVar121._16_4_ = 0x3fc00000;
    auVar121._20_4_ = 0x3fc00000;
    auVar121._24_4_ = 0x3fc00000;
    auVar121._28_4_ = 0x3fc00000;
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar104,auVar121);
    auVar128._4_4_ = auVar111._4_4_ * auVar105._4_4_;
    auVar128._0_4_ = auVar111._0_4_ * auVar105._0_4_;
    auVar128._8_4_ = auVar111._8_4_ * auVar105._8_4_;
    auVar128._12_4_ = auVar111._12_4_ * auVar105._12_4_;
    auVar128._16_4_ = auVar111._16_4_ * auVar105._16_4_;
    auVar128._20_4_ = auVar111._20_4_ * auVar105._20_4_;
    auVar128._24_4_ = auVar111._24_4_ * auVar105._24_4_;
    auVar128._28_4_ = auVar104._28_4_;
    auVar104 = vmulps_avx512vl(auVar106,auVar111);
    auVar119 = vmulps_avx512vl(auVar107,auVar111);
    auVar120 = vsubps_avx512vl(auVar130,auVar108);
    auVar121 = vsubps_avx512vl(auVar130,auVar109);
    auVar124 = vsubps_avx512vl(auVar130,auVar110);
    auVar122 = vmulps_avx512vl(local_560,auVar124);
    auVar122 = vfmadd231ps_avx512vl(auVar122,local_540,auVar121);
    auVar122 = vfmadd231ps_avx512vl(auVar122,local_520,auVar120);
    auVar125 = vmulps_avx512vl(auVar124,auVar124);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar121,auVar121);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar120,auVar120);
    auVar127 = vmulps_avx512vl(local_560,auVar119);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar104,local_540);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar128,local_520);
    auVar119 = vmulps_avx512vl(auVar124,auVar119);
    auVar104 = vfmadd231ps_avx512vl(auVar119,auVar121,auVar104);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar120,auVar128);
    local_580 = vmulps_avx512vl(auVar127,auVar127);
    auVar119 = vsubps_avx512vl(local_1e0,local_580);
    auVar128 = vmulps_avx512vl(auVar127,auVar104);
    auVar122 = vsubps_avx512vl(auVar122,auVar128);
    auVar128 = vaddps_avx512vl(auVar122,auVar122);
    auVar122 = vmulps_avx512vl(auVar104,auVar104);
    auVar125 = vsubps_avx512vl(auVar125,auVar122);
    auVar126 = vsubps_avx512vl(auVar125,auVar126);
    local_760 = vmulps_avx512vl(auVar128,auVar128);
    auVar122._8_4_ = 0x40800000;
    auVar122._0_8_ = 0x4080000040800000;
    auVar122._12_4_ = 0x40800000;
    auVar122._16_4_ = 0x40800000;
    auVar122._20_4_ = 0x40800000;
    auVar122._24_4_ = 0x40800000;
    auVar122._28_4_ = 0x40800000;
    auVar122 = vmulps_avx512vl(auVar119,auVar122);
    auVar129 = vmulps_avx512vl(auVar122,auVar126);
    auVar129 = vsubps_avx512vl(local_760,auVar129);
    uVar75 = vcmpps_avx512vl(auVar129,auVar130,5);
    bVar59 = (byte)uVar75;
    if (bVar59 == 0) {
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar132 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar129 = vsqrtps_avx512vl(auVar129);
      auVar130 = vaddps_avx512vl(auVar119,auVar119);
      auVar131 = vrcp14ps_avx512vl(auVar130);
      auVar123 = vfnmadd213ps_avx512vl(auVar130,auVar131,auVar123);
      auVar123 = vfmadd132ps_avx512vl(auVar123,auVar131,auVar131);
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      auVar130 = vxorps_avx512vl(auVar128,auVar29);
      auVar130 = vsubps_avx512vl(auVar130,auVar129);
      auVar130 = vmulps_avx512vl(auVar130,auVar123);
      auVar129 = vsubps_avx512vl(auVar129,auVar128);
      auVar123 = vmulps_avx512vl(auVar129,auVar123);
      auVar129 = vfmadd213ps_avx512vl(auVar127,auVar130,auVar104);
      local_4a0 = vmulps_avx512vl(auVar111,auVar129);
      auVar129 = vfmadd213ps_avx512vl(auVar127,auVar123,auVar104);
      local_4c0 = vmulps_avx512vl(auVar111,auVar129);
      auVar129 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar129 = vblendmps_avx512vl(auVar129,auVar130);
      auVar131._0_4_ =
           (uint)(bVar59 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar59 & 1) * local_4c0._0_4_;
      bVar73 = (bool)((byte)(uVar75 >> 1) & 1);
      auVar131._4_4_ = (uint)bVar73 * auVar129._4_4_ | (uint)!bVar73 * local_4c0._4_4_;
      bVar73 = (bool)((byte)(uVar75 >> 2) & 1);
      auVar131._8_4_ = (uint)bVar73 * auVar129._8_4_ | (uint)!bVar73 * local_4c0._8_4_;
      bVar73 = (bool)((byte)(uVar75 >> 3) & 1);
      auVar131._12_4_ = (uint)bVar73 * auVar129._12_4_ | (uint)!bVar73 * local_4c0._12_4_;
      bVar73 = (bool)((byte)(uVar75 >> 4) & 1);
      auVar131._16_4_ = (uint)bVar73 * auVar129._16_4_ | (uint)!bVar73 * local_4c0._16_4_;
      bVar73 = (bool)((byte)(uVar75 >> 5) & 1);
      auVar131._20_4_ = (uint)bVar73 * auVar129._20_4_ | (uint)!bVar73 * local_4c0._20_4_;
      bVar73 = (bool)((byte)(uVar75 >> 6) & 1);
      auVar131._24_4_ = (uint)bVar73 * auVar129._24_4_ | (uint)!bVar73 * local_4c0._24_4_;
      bVar73 = SUB81(uVar75 >> 7,0);
      auVar131._28_4_ = (uint)bVar73 * auVar129._28_4_ | (uint)!bVar73 * local_4c0._28_4_;
      auVar240._8_4_ = 0xff800000;
      auVar240._0_8_ = 0xff800000ff800000;
      auVar240._12_4_ = 0xff800000;
      auVar240._16_4_ = 0xff800000;
      auVar240._20_4_ = 0xff800000;
      auVar240._24_4_ = 0xff800000;
      auVar240._28_4_ = 0xff800000;
      auVar129 = vblendmps_avx512vl(auVar240,auVar123);
      auVar132._0_4_ =
           (uint)(bVar59 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar123._0_4_;
      bVar73 = (bool)((byte)(uVar75 >> 1) & 1);
      auVar132._4_4_ = (uint)bVar73 * auVar129._4_4_ | (uint)!bVar73 * auVar123._4_4_;
      bVar73 = (bool)((byte)(uVar75 >> 2) & 1);
      auVar132._8_4_ = (uint)bVar73 * auVar129._8_4_ | (uint)!bVar73 * auVar123._8_4_;
      bVar73 = (bool)((byte)(uVar75 >> 3) & 1);
      auVar132._12_4_ = (uint)bVar73 * auVar129._12_4_ | (uint)!bVar73 * auVar123._12_4_;
      bVar73 = (bool)((byte)(uVar75 >> 4) & 1);
      auVar132._16_4_ = (uint)bVar73 * auVar129._16_4_ | (uint)!bVar73 * auVar123._16_4_;
      bVar73 = (bool)((byte)(uVar75 >> 5) & 1);
      auVar132._20_4_ = (uint)bVar73 * auVar129._20_4_ | (uint)!bVar73 * auVar123._20_4_;
      bVar73 = (bool)((byte)(uVar75 >> 6) & 1);
      auVar132._24_4_ = (uint)bVar73 * auVar129._24_4_ | (uint)!bVar73 * auVar123._24_4_;
      bVar73 = SUB81(uVar75 >> 7,0);
      auVar132._28_4_ = (uint)bVar73 * auVar129._28_4_ | (uint)!bVar73 * auVar123._28_4_;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_580,auVar123);
      auVar129 = vmaxps_avx512vl(local_3e0,auVar123);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      auVar129 = vmulps_avx512vl(auVar129,auVar30);
      vandps_avx512vl(auVar119,auVar123);
      uVar64 = vcmpps_avx512vl(auVar129,auVar129,1);
      uVar75 = uVar75 & uVar64;
      bVar66 = (byte)uVar75;
      if (bVar66 != 0) {
        uVar64 = vcmpps_avx512vl(auVar126,_DAT_02020f00,2);
        auVar253._8_4_ = 0xff800000;
        auVar253._0_8_ = 0xff800000ff800000;
        auVar253._12_4_ = 0xff800000;
        auVar253._16_4_ = 0xff800000;
        auVar253._20_4_ = 0xff800000;
        auVar253._24_4_ = 0xff800000;
        auVar253._28_4_ = 0xff800000;
        auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar126 = vblendmps_avx512vl(auVar123,auVar253);
        bVar61 = (byte)uVar64;
        uVar76 = (uint)(bVar61 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar129._0_4_;
        bVar73 = (bool)((byte)(uVar64 >> 1) & 1);
        uVar149 = (uint)bVar73 * auVar126._4_4_ | (uint)!bVar73 * auVar129._4_4_;
        bVar73 = (bool)((byte)(uVar64 >> 2) & 1);
        uVar150 = (uint)bVar73 * auVar126._8_4_ | (uint)!bVar73 * auVar129._8_4_;
        bVar73 = (bool)((byte)(uVar64 >> 3) & 1);
        uVar151 = (uint)bVar73 * auVar126._12_4_ | (uint)!bVar73 * auVar129._12_4_;
        bVar73 = (bool)((byte)(uVar64 >> 4) & 1);
        uVar152 = (uint)bVar73 * auVar126._16_4_ | (uint)!bVar73 * auVar129._16_4_;
        bVar73 = (bool)((byte)(uVar64 >> 5) & 1);
        uVar153 = (uint)bVar73 * auVar126._20_4_ | (uint)!bVar73 * auVar129._20_4_;
        bVar73 = (bool)((byte)(uVar64 >> 6) & 1);
        uVar154 = (uint)bVar73 * auVar126._24_4_ | (uint)!bVar73 * auVar129._24_4_;
        bVar73 = SUB81(uVar64 >> 7,0);
        uVar155 = (uint)bVar73 * auVar126._28_4_ | (uint)!bVar73 * auVar129._28_4_;
        auVar131._0_4_ = (bVar66 & 1) * uVar76 | !(bool)(bVar66 & 1) * auVar131._0_4_;
        bVar73 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar131._4_4_ = bVar73 * uVar149 | !bVar73 * auVar131._4_4_;
        bVar73 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar131._8_4_ = bVar73 * uVar150 | !bVar73 * auVar131._8_4_;
        bVar73 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar131._12_4_ = bVar73 * uVar151 | !bVar73 * auVar131._12_4_;
        bVar73 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar131._16_4_ = bVar73 * uVar152 | !bVar73 * auVar131._16_4_;
        bVar73 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar131._20_4_ = bVar73 * uVar153 | !bVar73 * auVar131._20_4_;
        bVar73 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar131._24_4_ = bVar73 * uVar154 | !bVar73 * auVar131._24_4_;
        bVar73 = SUB81(uVar75 >> 7,0);
        auVar131._28_4_ = bVar73 * uVar155 | !bVar73 * auVar131._28_4_;
        auVar123 = vblendmps_avx512vl(auVar253,auVar123);
        bVar73 = (bool)((byte)(uVar64 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar64 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar64 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar64 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
        bVar15 = SUB81(uVar64 >> 7,0);
        auVar132._0_4_ =
             (uint)(bVar66 & 1) *
             ((uint)(bVar61 & 1) * auVar123._0_4_ | !(bool)(bVar61 & 1) * uVar76) |
             !(bool)(bVar66 & 1) * auVar132._0_4_;
        bVar9 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar132._4_4_ =
             (uint)bVar9 * ((uint)bVar73 * auVar123._4_4_ | !bVar73 * uVar149) |
             !bVar9 * auVar132._4_4_;
        bVar73 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar132._8_4_ =
             (uint)bVar73 * ((uint)bVar10 * auVar123._8_4_ | !bVar10 * uVar150) |
             !bVar73 * auVar132._8_4_;
        bVar73 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar132._12_4_ =
             (uint)bVar73 * ((uint)bVar11 * auVar123._12_4_ | !bVar11 * uVar151) |
             !bVar73 * auVar132._12_4_;
        bVar73 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar132._16_4_ =
             (uint)bVar73 * ((uint)bVar12 * auVar123._16_4_ | !bVar12 * uVar152) |
             !bVar73 * auVar132._16_4_;
        bVar73 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar132._20_4_ =
             (uint)bVar73 * ((uint)bVar13 * auVar123._20_4_ | !bVar13 * uVar153) |
             !bVar73 * auVar132._20_4_;
        bVar73 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar132._24_4_ =
             (uint)bVar73 * ((uint)bVar14 * auVar123._24_4_ | !bVar14 * uVar154) |
             !bVar73 * auVar132._24_4_;
        bVar73 = SUB81(uVar75 >> 7,0);
        auVar132._28_4_ =
             (uint)bVar73 * ((uint)bVar15 * auVar123._28_4_ | !bVar15 * uVar155) |
             !bVar73 * auVar132._28_4_;
        bVar59 = (~bVar66 | bVar61) & bVar59;
      }
      auVar245 = ZEXT3264(_DAT_02020f20);
    }
    if ((bVar59 & 0x7f) == 0) {
      auVar136._8_4_ = 0x3f800000;
      auVar136._0_8_ = &DAT_3f8000003f800000;
      auVar136._12_4_ = 0x3f800000;
      auVar136._16_4_ = 0x3f800000;
      auVar136._20_4_ = 0x3f800000;
      auVar136._24_4_ = 0x3f800000;
      auVar136._28_4_ = 0x3f800000;
LAB_01c3c366:
      auVar292 = ZEXT3264(auVar135);
      auVar278 = ZEXT3264(auVar114);
      auVar228 = ZEXT3264(auVar136);
      auVar284 = ZEXT3264(_local_780);
      auVar297 = ZEXT3264(local_7a0);
    }
    else {
      fVar277 = *(float *)(ray + k * 4 + 0x100) - (float)local_630._0_4_;
      auVar241._4_4_ = fVar277;
      auVar241._0_4_ = fVar277;
      auVar241._8_4_ = fVar277;
      auVar241._12_4_ = fVar277;
      auVar241._16_4_ = fVar277;
      auVar241._20_4_ = fVar277;
      auVar241._24_4_ = fVar277;
      auVar241._28_4_ = fVar277;
      auVar123 = vminps_avx512vl(auVar241,auVar132);
      auVar58._4_4_ = fStack_1fc;
      auVar58._0_4_ = local_200;
      auVar58._8_4_ = fStack_1f8;
      auVar58._12_4_ = fStack_1f4;
      auVar58._16_4_ = fStack_1f0;
      auVar58._20_4_ = fStack_1ec;
      auVar58._24_4_ = fStack_1e8;
      auVar58._28_4_ = fStack_1e4;
      auVar126 = vmaxps_avx512vl(auVar58,auVar131);
      auVar124 = vmulps_avx512vl(auVar135,auVar124);
      auVar121 = vfmadd213ps_avx512vl(auVar121,auVar134,auVar124);
      auVar120 = vfmadd213ps_avx512vl(auVar120,auVar133,auVar121);
      auVar121 = vmulps_avx512vl(local_560,auVar135);
      auVar121 = vfmadd231ps_avx512vl(auVar121,local_540,auVar134);
      auVar121 = vfmadd231ps_avx512vl(auVar121,local_520,auVar133);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar121,auVar124);
      auVar133 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar17 = vcmpps_avx512vl(auVar124,auVar133,1);
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar120 = vxorps_avx512vl(auVar120,auVar134);
      auVar135 = vrcp14ps_avx512vl(auVar121);
      auVar129 = vxorps_avx512vl(auVar121,auVar134);
      auVar136 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar130 = vfnmadd213ps_avx512vl(auVar135,auVar121,auVar136);
      auVar130 = vfmadd132ps_avx512vl(auVar130,auVar135,auVar135);
      auVar130 = vmulps_avx512vl(auVar130,auVar120);
      uVar18 = vcmpps_avx512vl(auVar121,auVar129,1);
      bVar66 = (byte)uVar17 | (byte)uVar18;
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar120 = vblendmps_avx512vl(auVar130,auVar131);
      auVar137._0_4_ =
           (uint)(bVar66 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar135._0_4_;
      bVar73 = (bool)(bVar66 >> 1 & 1);
      auVar137._4_4_ = (uint)bVar73 * auVar120._4_4_ | (uint)!bVar73 * auVar135._4_4_;
      bVar73 = (bool)(bVar66 >> 2 & 1);
      auVar137._8_4_ = (uint)bVar73 * auVar120._8_4_ | (uint)!bVar73 * auVar135._8_4_;
      bVar73 = (bool)(bVar66 >> 3 & 1);
      auVar137._12_4_ = (uint)bVar73 * auVar120._12_4_ | (uint)!bVar73 * auVar135._12_4_;
      bVar73 = (bool)(bVar66 >> 4 & 1);
      auVar137._16_4_ = (uint)bVar73 * auVar120._16_4_ | (uint)!bVar73 * auVar135._16_4_;
      bVar73 = (bool)(bVar66 >> 5 & 1);
      auVar137._20_4_ = (uint)bVar73 * auVar120._20_4_ | (uint)!bVar73 * auVar135._20_4_;
      bVar73 = (bool)(bVar66 >> 6 & 1);
      auVar137._24_4_ = (uint)bVar73 * auVar120._24_4_ | (uint)!bVar73 * auVar135._24_4_;
      auVar137._28_4_ =
           (uint)(bVar66 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar66 >> 7) * auVar135._28_4_;
      auVar120 = vmaxps_avx(auVar126,auVar137);
      uVar18 = vcmpps_avx512vl(auVar121,auVar129,6);
      bVar66 = (byte)uVar17 | (byte)uVar18;
      auVar135._8_4_ = 0x7f800000;
      auVar135._0_8_ = 0x7f8000007f800000;
      auVar135._12_4_ = 0x7f800000;
      auVar135._16_4_ = 0x7f800000;
      auVar135._20_4_ = 0x7f800000;
      auVar135._24_4_ = 0x7f800000;
      auVar135._28_4_ = 0x7f800000;
      auVar138._0_4_ = (uint)(bVar66 & 1) * 0x7f800000 | (uint)!(bool)(bVar66 & 1) * auVar130._0_4_;
      bVar73 = (bool)(bVar66 >> 1 & 1);
      auVar138._4_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * auVar130._4_4_;
      bVar73 = (bool)(bVar66 >> 2 & 1);
      auVar138._8_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * auVar130._8_4_;
      bVar73 = (bool)(bVar66 >> 3 & 1);
      auVar138._12_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * auVar130._12_4_;
      bVar73 = (bool)(bVar66 >> 4 & 1);
      auVar138._16_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * auVar130._16_4_;
      bVar73 = (bool)(bVar66 >> 5 & 1);
      auVar138._20_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * auVar130._20_4_;
      bVar73 = (bool)(bVar66 >> 6 & 1);
      auVar138._24_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * auVar130._24_4_;
      auVar138._28_4_ =
           (uint)(bVar66 >> 7) * 0x7f800000 | (uint)!(bool)(bVar66 >> 7) * auVar130._28_4_;
      auVar121 = vminps_avx(auVar123,auVar138);
      auVar83 = vxorps_avx512vl(auVar129._0_16_,auVar129._0_16_);
      auVar113 = vsubps_avx512vl(ZEXT1632(auVar83),auVar113);
      auVar123 = vsubps_avx512vl(ZEXT1632(auVar83),auVar114);
      auVar126 = ZEXT1632(auVar83);
      auVar115 = vsubps_avx512vl(auVar126,auVar115);
      auVar115 = vmulps_avx512vl(auVar115,auVar118);
      auVar115 = vfnmsub231ps_avx512vl(auVar115,auVar117,auVar123);
      auVar113 = vfnmadd231ps_avx512vl(auVar115,auVar116,auVar113);
      auVar115 = vmulps_avx512vl(local_560,auVar118);
      auVar115 = vfnmsub231ps_avx512vl(auVar115,local_540,auVar117);
      auVar115 = vfnmadd231ps_avx512vl(auVar115,local_520,auVar116);
      vandps_avx512vl(auVar115,auVar124);
      uVar17 = vcmpps_avx512vl(auVar115,auVar133,1);
      auVar113 = vxorps_avx512vl(auVar113,auVar134);
      auVar116 = vrcp14ps_avx512vl(auVar115);
      auVar117 = vxorps_avx512vl(auVar115,auVar134);
      auVar118 = vfnmadd213ps_avx512vl(auVar116,auVar115,auVar136);
      auVar83 = vfmadd132ps_fma(auVar118,auVar116,auVar116);
      auVar289 = ZEXT1664(auVar83);
      fVar277 = auVar83._0_4_ * auVar113._0_4_;
      fVar279 = auVar83._4_4_ * auVar113._4_4_;
      auVar39._4_4_ = fVar279;
      auVar39._0_4_ = fVar277;
      fVar280 = auVar83._8_4_ * auVar113._8_4_;
      auVar39._8_4_ = fVar280;
      fVar281 = auVar83._12_4_ * auVar113._12_4_;
      auVar39._12_4_ = fVar281;
      fVar267 = auVar113._16_4_ * 0.0;
      auVar39._16_4_ = fVar267;
      fVar268 = auVar113._20_4_ * 0.0;
      auVar39._20_4_ = fVar268;
      fVar282 = auVar113._24_4_ * 0.0;
      auVar39._24_4_ = fVar282;
      auVar39._28_4_ = auVar113._28_4_;
      uVar18 = vcmpps_avx512vl(auVar115,auVar117,1);
      bVar66 = (byte)uVar17 | (byte)uVar18;
      auVar118 = vblendmps_avx512vl(auVar39,auVar131);
      auVar139._0_4_ =
           (uint)(bVar66 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar116._0_4_;
      bVar73 = (bool)(bVar66 >> 1 & 1);
      auVar139._4_4_ = (uint)bVar73 * auVar118._4_4_ | (uint)!bVar73 * auVar116._4_4_;
      bVar73 = (bool)(bVar66 >> 2 & 1);
      auVar139._8_4_ = (uint)bVar73 * auVar118._8_4_ | (uint)!bVar73 * auVar116._8_4_;
      bVar73 = (bool)(bVar66 >> 3 & 1);
      auVar139._12_4_ = (uint)bVar73 * auVar118._12_4_ | (uint)!bVar73 * auVar116._12_4_;
      bVar73 = (bool)(bVar66 >> 4 & 1);
      auVar139._16_4_ = (uint)bVar73 * auVar118._16_4_ | (uint)!bVar73 * auVar116._16_4_;
      bVar73 = (bool)(bVar66 >> 5 & 1);
      auVar139._20_4_ = (uint)bVar73 * auVar118._20_4_ | (uint)!bVar73 * auVar116._20_4_;
      bVar73 = (bool)(bVar66 >> 6 & 1);
      auVar139._24_4_ = (uint)bVar73 * auVar118._24_4_ | (uint)!bVar73 * auVar116._24_4_;
      auVar139._28_4_ =
           (uint)(bVar66 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar66 >> 7) * auVar116._28_4_;
      _local_5a0 = vmaxps_avx(auVar120,auVar139);
      uVar18 = vcmpps_avx512vl(auVar115,auVar117,6);
      bVar66 = (byte)uVar17 | (byte)uVar18;
      auVar114._0_4_ = (uint)(bVar66 & 1) * 0x7f800000 | (uint)!(bool)(bVar66 & 1) * (int)fVar277;
      bVar73 = (bool)(bVar66 >> 1 & 1);
      auVar114._4_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar279;
      bVar73 = (bool)(bVar66 >> 2 & 1);
      auVar114._8_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar280;
      bVar73 = (bool)(bVar66 >> 3 & 1);
      auVar114._12_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar281;
      bVar73 = (bool)(bVar66 >> 4 & 1);
      auVar114._16_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar267;
      bVar73 = (bool)(bVar66 >> 5 & 1);
      auVar114._20_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar268;
      bVar73 = (bool)(bVar66 >> 6 & 1);
      auVar114._24_4_ = (uint)bVar73 * 0x7f800000 | (uint)!bVar73 * (int)fVar282;
      auVar114._28_4_ =
           (uint)(bVar66 >> 7) * 0x7f800000 | (uint)!(bool)(bVar66 >> 7) * auVar113._28_4_;
      local_280 = vminps_avx(auVar121,auVar114);
      auVar276 = ZEXT3264(local_280);
      uVar17 = vcmpps_avx512vl(_local_5a0,local_280,2);
      bVar59 = bVar59 & 0x7f & (byte)uVar17;
      if (bVar59 == 0) {
        auVar245 = ZEXT3264(_DAT_02020f20);
        goto LAB_01c3c366;
      }
      auVar120 = vmaxps_avx512vl(auVar126,auVar112);
      auVar112 = vminps_avx512vl(local_4a0,auVar136);
      auVar48 = ZEXT412(0);
      auVar121 = ZEXT1232(auVar48) << 0x20;
      auVar112 = vmaxps_avx(auVar112,ZEXT1232(auVar48) << 0x20);
      auVar113 = vminps_avx512vl(local_4c0,auVar136);
      auVar40._4_4_ = (auVar112._4_4_ + 1.0) * 0.125;
      auVar40._0_4_ = (auVar112._0_4_ + 0.0) * 0.125;
      auVar40._8_4_ = (auVar112._8_4_ + 2.0) * 0.125;
      auVar40._12_4_ = (auVar112._12_4_ + 3.0) * 0.125;
      auVar40._16_4_ = (auVar112._16_4_ + 4.0) * 0.125;
      auVar40._20_4_ = (auVar112._20_4_ + 5.0) * 0.125;
      auVar40._24_4_ = (auVar112._24_4_ + 6.0) * 0.125;
      auVar40._28_4_ = auVar112._28_4_ + 7.0;
      local_4a0 = vfmadd213ps_avx512vl(auVar40,local_740,auVar251);
      auVar112 = vmaxps_avx(auVar113,ZEXT1232(auVar48) << 0x20);
      auVar41._4_4_ = (auVar112._4_4_ + 1.0) * 0.125;
      auVar41._0_4_ = (auVar112._0_4_ + 0.0) * 0.125;
      auVar41._8_4_ = (auVar112._8_4_ + 2.0) * 0.125;
      auVar41._12_4_ = (auVar112._12_4_ + 3.0) * 0.125;
      auVar41._16_4_ = (auVar112._16_4_ + 4.0) * 0.125;
      auVar41._20_4_ = (auVar112._20_4_ + 5.0) * 0.125;
      auVar41._24_4_ = (auVar112._24_4_ + 6.0) * 0.125;
      auVar41._28_4_ = auVar112._28_4_ + 7.0;
      local_4c0 = vfmadd213ps_avx512vl(auVar41,local_740,auVar251);
      auVar42._4_4_ = auVar120._4_4_ * auVar120._4_4_;
      auVar42._0_4_ = auVar120._0_4_ * auVar120._0_4_;
      auVar42._8_4_ = auVar120._8_4_ * auVar120._8_4_;
      auVar42._12_4_ = auVar120._12_4_ * auVar120._12_4_;
      auVar42._16_4_ = auVar120._16_4_ * auVar120._16_4_;
      auVar42._20_4_ = auVar120._20_4_ * auVar120._20_4_;
      auVar42._24_4_ = auVar120._24_4_ * auVar120._24_4_;
      auVar42._28_4_ = local_4c0._28_4_;
      auVar112 = vsubps_avx(auVar125,auVar42);
      local_a20 = auVar122._0_4_;
      fStack_a1c = auVar122._4_4_;
      fStack_a18 = auVar122._8_4_;
      fStack_a14 = auVar122._12_4_;
      fStack_a10 = auVar122._16_4_;
      fStack_a0c = auVar122._20_4_;
      fStack_a08 = auVar122._24_4_;
      auVar43._4_4_ = auVar112._4_4_ * fStack_a1c;
      auVar43._0_4_ = auVar112._0_4_ * local_a20;
      auVar43._8_4_ = auVar112._8_4_ * fStack_a18;
      auVar43._12_4_ = auVar112._12_4_ * fStack_a14;
      auVar43._16_4_ = auVar112._16_4_ * fStack_a10;
      auVar43._20_4_ = auVar112._20_4_ * fStack_a0c;
      auVar43._24_4_ = auVar112._24_4_ * fStack_a08;
      auVar43._28_4_ = local_4c0._28_4_;
      auVar120 = vsubps_avx(local_760,auVar43);
      uVar17 = vcmpps_avx512vl(auVar120,ZEXT1232(auVar48) << 0x20,5);
      bVar66 = (byte)uVar17;
      if (bVar66 == 0) {
        auVar104 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar228 = ZEXT864(0) << 0x20;
        auVar120 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar122 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar278 = ZEXT864(0) << 0x20;
        auVar140._8_4_ = 0x7f800000;
        auVar140._0_8_ = 0x7f8000007f800000;
        auVar140._12_4_ = 0x7f800000;
        auVar140._16_4_ = 0x7f800000;
        auVar140._20_4_ = 0x7f800000;
        auVar140._24_4_ = 0x7f800000;
        auVar140._28_4_ = 0x7f800000;
        auVar141._8_4_ = 0xff800000;
        auVar141._0_8_ = 0xff800000ff800000;
        auVar141._12_4_ = 0xff800000;
        auVar141._16_4_ = 0xff800000;
        auVar141._20_4_ = 0xff800000;
        auVar141._24_4_ = 0xff800000;
        auVar141._28_4_ = 0xff800000;
      }
      else {
        auVar84 = vxorps_avx512vl(local_580._0_16_,local_580._0_16_);
        uVar75 = vcmpps_avx512vl(auVar120,auVar126,5);
        auVar120 = vsqrtps_avx(auVar120);
        auVar252._0_4_ = auVar119._0_4_ + auVar119._0_4_;
        auVar252._4_4_ = auVar119._4_4_ + auVar119._4_4_;
        auVar252._8_4_ = auVar119._8_4_ + auVar119._8_4_;
        auVar252._12_4_ = auVar119._12_4_ + auVar119._12_4_;
        auVar252._16_4_ = auVar119._16_4_ + auVar119._16_4_;
        auVar252._20_4_ = auVar119._20_4_ + auVar119._20_4_;
        auVar252._24_4_ = auVar119._24_4_ + auVar119._24_4_;
        auVar252._28_4_ = auVar119._28_4_ + auVar119._28_4_;
        auVar121 = vrcp14ps_avx512vl(auVar252);
        auVar122 = vfnmadd213ps_avx512vl(auVar252,auVar121,auVar136);
        auVar83 = vfmadd132ps_fma(auVar122,auVar121,auVar121);
        auVar31._8_4_ = 0x80000000;
        auVar31._0_8_ = 0x8000000080000000;
        auVar31._12_4_ = 0x80000000;
        auVar31._16_4_ = 0x80000000;
        auVar31._20_4_ = 0x80000000;
        auVar31._24_4_ = 0x80000000;
        auVar31._28_4_ = 0x80000000;
        auVar121 = vxorps_avx512vl(auVar128,auVar31);
        auVar121 = vsubps_avx(auVar121,auVar120);
        auVar44._4_4_ = auVar121._4_4_ * auVar83._4_4_;
        auVar44._0_4_ = auVar121._0_4_ * auVar83._0_4_;
        auVar44._8_4_ = auVar121._8_4_ * auVar83._8_4_;
        auVar44._12_4_ = auVar121._12_4_ * auVar83._12_4_;
        auVar44._16_4_ = auVar121._16_4_ * 0.0;
        auVar44._20_4_ = auVar121._20_4_ * 0.0;
        auVar44._24_4_ = auVar121._24_4_ * 0.0;
        auVar44._28_4_ = 0x3e000000;
        auVar120 = vsubps_avx512vl(auVar120,auVar128);
        auVar45._4_4_ = auVar120._4_4_ * auVar83._4_4_;
        auVar45._0_4_ = auVar120._0_4_ * auVar83._0_4_;
        auVar45._8_4_ = auVar120._8_4_ * auVar83._8_4_;
        auVar45._12_4_ = auVar120._12_4_ * auVar83._12_4_;
        auVar45._16_4_ = auVar120._16_4_ * 0.0;
        auVar45._20_4_ = auVar120._20_4_ * 0.0;
        auVar45._24_4_ = auVar120._24_4_ * 0.0;
        auVar45._28_4_ = fVar186;
        auVar120 = vfmadd213ps_avx512vl(auVar127,auVar44,auVar104);
        auVar46._4_4_ = auVar111._4_4_ * auVar120._4_4_;
        auVar46._0_4_ = auVar111._0_4_ * auVar120._0_4_;
        auVar46._8_4_ = auVar111._8_4_ * auVar120._8_4_;
        auVar46._12_4_ = auVar111._12_4_ * auVar120._12_4_;
        auVar46._16_4_ = auVar111._16_4_ * auVar120._16_4_;
        auVar46._20_4_ = auVar111._20_4_ * auVar120._20_4_;
        auVar46._24_4_ = auVar111._24_4_ * auVar120._24_4_;
        auVar46._28_4_ = auVar121._28_4_;
        auVar120 = vmulps_avx512vl(local_520,auVar44);
        auVar121 = vmulps_avx512vl(local_540,auVar44);
        auVar113 = vmulps_avx512vl(local_560,auVar44);
        auVar122 = vfmadd213ps_avx512vl(auVar105,auVar46,auVar108);
        auVar120 = vsubps_avx512vl(auVar120,auVar122);
        auVar122 = vfmadd213ps_avx512vl(auVar106,auVar46,auVar109);
        auVar122 = vsubps_avx512vl(auVar121,auVar122);
        auVar83 = vfmadd213ps_fma(auVar46,auVar107,auVar110);
        auVar121 = vsubps_avx(auVar113,ZEXT1632(auVar83));
        auVar278 = ZEXT3264(auVar121);
        auVar104 = vfmadd213ps_avx512vl(auVar127,auVar45,auVar104);
        auVar111 = vmulps_avx512vl(auVar111,auVar104);
        auVar104 = vmulps_avx512vl(local_520,auVar45);
        auVar113 = vmulps_avx512vl(local_540,auVar45);
        auVar115 = vmulps_avx512vl(local_560,auVar45);
        auVar83 = vfmadd213ps_fma(auVar105,auVar111,auVar108);
        auVar121 = vsubps_avx(auVar104,ZEXT1632(auVar83));
        auVar83 = vfmadd213ps_fma(auVar106,auVar111,auVar109);
        auVar104 = vsubps_avx512vl(auVar113,ZEXT1632(auVar83));
        auVar83 = vfmadd213ps_fma(auVar107,auVar111,auVar110);
        auVar105 = vsubps_avx512vl(auVar115,ZEXT1632(auVar83));
        auVar228 = ZEXT3264(auVar105);
        auVar170._8_4_ = 0x7f800000;
        auVar170._0_8_ = 0x7f8000007f800000;
        auVar170._12_4_ = 0x7f800000;
        auVar170._16_4_ = 0x7f800000;
        auVar170._20_4_ = 0x7f800000;
        auVar170._24_4_ = 0x7f800000;
        auVar170._28_4_ = 0x7f800000;
        auVar105 = vblendmps_avx512vl(auVar170,auVar44);
        bVar73 = (bool)((byte)uVar75 & 1);
        auVar140._0_4_ = (uint)bVar73 * auVar105._0_4_ | (uint)!bVar73 * auVar108._0_4_;
        bVar73 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar140._4_4_ = (uint)bVar73 * auVar105._4_4_ | (uint)!bVar73 * auVar108._4_4_;
        bVar73 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar140._8_4_ = (uint)bVar73 * auVar105._8_4_ | (uint)!bVar73 * auVar108._8_4_;
        bVar73 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar140._12_4_ = (uint)bVar73 * auVar105._12_4_ | (uint)!bVar73 * auVar108._12_4_;
        bVar73 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar140._16_4_ = (uint)bVar73 * auVar105._16_4_ | (uint)!bVar73 * auVar108._16_4_;
        bVar73 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar140._20_4_ = (uint)bVar73 * auVar105._20_4_ | (uint)!bVar73 * auVar108._20_4_;
        bVar73 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar140._24_4_ = (uint)bVar73 * auVar105._24_4_ | (uint)!bVar73 * auVar108._24_4_;
        bVar73 = SUB81(uVar75 >> 7,0);
        auVar140._28_4_ = (uint)bVar73 * auVar105._28_4_ | (uint)!bVar73 * auVar108._28_4_;
        auVar171._8_4_ = 0xff800000;
        auVar171._0_8_ = 0xff800000ff800000;
        auVar171._12_4_ = 0xff800000;
        auVar171._16_4_ = 0xff800000;
        auVar171._20_4_ = 0xff800000;
        auVar171._24_4_ = 0xff800000;
        auVar171._28_4_ = 0xff800000;
        auVar105 = vblendmps_avx512vl(auVar171,auVar45);
        bVar73 = (bool)((byte)uVar75 & 1);
        auVar141._0_4_ = (uint)bVar73 * auVar105._0_4_ | (uint)!bVar73 * -0x800000;
        bVar73 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar141._4_4_ = (uint)bVar73 * auVar105._4_4_ | (uint)!bVar73 * -0x800000;
        bVar73 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar141._8_4_ = (uint)bVar73 * auVar105._8_4_ | (uint)!bVar73 * -0x800000;
        bVar73 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar141._12_4_ = (uint)bVar73 * auVar105._12_4_ | (uint)!bVar73 * -0x800000;
        bVar73 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar141._16_4_ = (uint)bVar73 * auVar105._16_4_ | (uint)!bVar73 * -0x800000;
        bVar73 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar141._20_4_ = (uint)bVar73 * auVar105._20_4_ | (uint)!bVar73 * -0x800000;
        bVar73 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar141._24_4_ = (uint)bVar73 * auVar105._24_4_ | (uint)!bVar73 * -0x800000;
        bVar73 = SUB81(uVar75 >> 7,0);
        auVar141._28_4_ = (uint)bVar73 * auVar105._28_4_ | (uint)!bVar73 * -0x800000;
        auVar272._8_4_ = 0x7fffffff;
        auVar272._0_8_ = 0x7fffffff7fffffff;
        auVar272._12_4_ = 0x7fffffff;
        auVar272._16_4_ = 0x7fffffff;
        auVar272._20_4_ = 0x7fffffff;
        auVar272._24_4_ = 0x7fffffff;
        auVar272._28_4_ = 0x7fffffff;
        auVar105 = vandps_avx(auVar272,local_580);
        auVar105 = vmaxps_avx(local_3e0,auVar105);
        auVar32._8_4_ = 0x36000000;
        auVar32._0_8_ = 0x3600000036000000;
        auVar32._12_4_ = 0x36000000;
        auVar32._16_4_ = 0x36000000;
        auVar32._20_4_ = 0x36000000;
        auVar32._24_4_ = 0x36000000;
        auVar32._28_4_ = 0x36000000;
        auVar106 = vmulps_avx512vl(auVar105,auVar32);
        auVar105 = vandps_avx(auVar119,auVar272);
        uVar64 = vcmpps_avx512vl(auVar105,auVar106,1);
        uVar75 = uVar75 & uVar64;
        bVar61 = (byte)uVar75;
        if (bVar61 != 0) {
          uVar64 = vcmpps_avx512vl(auVar112,ZEXT1632(auVar84),2);
          auVar273._8_4_ = 0xff800000;
          auVar273._0_8_ = 0xff800000ff800000;
          auVar273._12_4_ = 0xff800000;
          auVar273._16_4_ = 0xff800000;
          auVar273._20_4_ = 0xff800000;
          auVar273._24_4_ = 0xff800000;
          auVar273._28_4_ = 0xff800000;
          auVar287._8_4_ = 0x7f800000;
          auVar287._0_8_ = 0x7f8000007f800000;
          auVar287._12_4_ = 0x7f800000;
          auVar287._16_4_ = 0x7f800000;
          auVar287._20_4_ = 0x7f800000;
          auVar287._24_4_ = 0x7f800000;
          auVar287._28_4_ = 0x7f800000;
          auVar112 = vblendmps_avx512vl(auVar287,auVar273);
          bVar65 = (byte)uVar64;
          uVar76 = (uint)(bVar65 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar106._0_4_;
          bVar73 = (bool)((byte)(uVar64 >> 1) & 1);
          uVar149 = (uint)bVar73 * auVar112._4_4_ | (uint)!bVar73 * auVar106._4_4_;
          bVar73 = (bool)((byte)(uVar64 >> 2) & 1);
          uVar150 = (uint)bVar73 * auVar112._8_4_ | (uint)!bVar73 * auVar106._8_4_;
          bVar73 = (bool)((byte)(uVar64 >> 3) & 1);
          uVar151 = (uint)bVar73 * auVar112._12_4_ | (uint)!bVar73 * auVar106._12_4_;
          bVar73 = (bool)((byte)(uVar64 >> 4) & 1);
          uVar152 = (uint)bVar73 * auVar112._16_4_ | (uint)!bVar73 * auVar106._16_4_;
          bVar73 = (bool)((byte)(uVar64 >> 5) & 1);
          uVar153 = (uint)bVar73 * auVar112._20_4_ | (uint)!bVar73 * auVar106._20_4_;
          bVar73 = (bool)((byte)(uVar64 >> 6) & 1);
          uVar154 = (uint)bVar73 * auVar112._24_4_ | (uint)!bVar73 * auVar106._24_4_;
          bVar73 = SUB81(uVar64 >> 7,0);
          uVar155 = (uint)bVar73 * auVar112._28_4_ | (uint)!bVar73 * auVar106._28_4_;
          auVar140._0_4_ = (bVar61 & 1) * uVar76 | !(bool)(bVar61 & 1) * auVar140._0_4_;
          bVar73 = (bool)((byte)(uVar75 >> 1) & 1);
          auVar140._4_4_ = bVar73 * uVar149 | !bVar73 * auVar140._4_4_;
          bVar73 = (bool)((byte)(uVar75 >> 2) & 1);
          auVar140._8_4_ = bVar73 * uVar150 | !bVar73 * auVar140._8_4_;
          bVar73 = (bool)((byte)(uVar75 >> 3) & 1);
          auVar140._12_4_ = bVar73 * uVar151 | !bVar73 * auVar140._12_4_;
          bVar73 = (bool)((byte)(uVar75 >> 4) & 1);
          auVar140._16_4_ = bVar73 * uVar152 | !bVar73 * auVar140._16_4_;
          bVar73 = (bool)((byte)(uVar75 >> 5) & 1);
          auVar140._20_4_ = bVar73 * uVar153 | !bVar73 * auVar140._20_4_;
          bVar73 = (bool)((byte)(uVar75 >> 6) & 1);
          auVar140._24_4_ = bVar73 * uVar154 | !bVar73 * auVar140._24_4_;
          bVar73 = SUB81(uVar75 >> 7,0);
          auVar140._28_4_ = bVar73 * uVar155 | !bVar73 * auVar140._28_4_;
          auVar112 = vblendmps_avx512vl(auVar273,auVar287);
          bVar73 = (bool)((byte)(uVar64 >> 1) & 1);
          bVar10 = (bool)((byte)(uVar64 >> 2) & 1);
          bVar11 = (bool)((byte)(uVar64 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
          bVar13 = (bool)((byte)(uVar64 >> 5) & 1);
          bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
          bVar15 = SUB81(uVar64 >> 7,0);
          auVar141._0_4_ =
               (uint)(bVar61 & 1) *
               ((uint)(bVar65 & 1) * auVar112._0_4_ | !(bool)(bVar65 & 1) * uVar76) |
               !(bool)(bVar61 & 1) * auVar141._0_4_;
          bVar9 = (bool)((byte)(uVar75 >> 1) & 1);
          auVar141._4_4_ =
               (uint)bVar9 * ((uint)bVar73 * auVar112._4_4_ | !bVar73 * uVar149) |
               !bVar9 * auVar141._4_4_;
          bVar73 = (bool)((byte)(uVar75 >> 2) & 1);
          auVar141._8_4_ =
               (uint)bVar73 * ((uint)bVar10 * auVar112._8_4_ | !bVar10 * uVar150) |
               !bVar73 * auVar141._8_4_;
          bVar73 = (bool)((byte)(uVar75 >> 3) & 1);
          auVar141._12_4_ =
               (uint)bVar73 * ((uint)bVar11 * auVar112._12_4_ | !bVar11 * uVar151) |
               !bVar73 * auVar141._12_4_;
          bVar73 = (bool)((byte)(uVar75 >> 4) & 1);
          auVar141._16_4_ =
               (uint)bVar73 * ((uint)bVar12 * auVar112._16_4_ | !bVar12 * uVar152) |
               !bVar73 * auVar141._16_4_;
          bVar73 = (bool)((byte)(uVar75 >> 5) & 1);
          auVar141._20_4_ =
               (uint)bVar73 * ((uint)bVar13 * auVar112._20_4_ | !bVar13 * uVar153) |
               !bVar73 * auVar141._20_4_;
          bVar73 = (bool)((byte)(uVar75 >> 6) & 1);
          auVar141._24_4_ =
               (uint)bVar73 * ((uint)bVar14 * auVar112._24_4_ | !bVar14 * uVar154) |
               !bVar73 * auVar141._24_4_;
          bVar73 = SUB81(uVar75 >> 7,0);
          auVar141._28_4_ =
               (uint)bVar73 * ((uint)bVar15 * auVar112._28_4_ | !bVar15 * uVar155) |
               !bVar73 * auVar141._28_4_;
          bVar66 = (~bVar61 | bVar65) & bVar66;
        }
      }
      auVar286._8_4_ = 0x7fffffff;
      auVar286._0_8_ = 0x7fffffff7fffffff;
      auVar286._12_4_ = 0x7fffffff;
      auVar297 = ZEXT3264(local_7a0);
      auVar292 = ZEXT3264(local_560);
      auVar245._0_4_ = local_560._0_4_ * auVar228._0_4_;
      auVar245._4_4_ = local_560._4_4_ * auVar228._4_4_;
      auVar245._8_4_ = local_560._8_4_ * auVar228._8_4_;
      auVar245._12_4_ = local_560._12_4_ * auVar228._12_4_;
      auVar245._16_4_ = local_560._16_4_ * auVar228._16_4_;
      auVar245._20_4_ = local_560._20_4_ * auVar228._20_4_;
      auVar245._28_36_ = auVar228._28_36_;
      auVar245._24_4_ = local_560._24_4_ * auVar228._24_4_;
      auVar289 = ZEXT3264(local_540);
      auVar83 = vfmadd231ps_fma(auVar245._0_32_,local_540,auVar104);
      auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),local_520,auVar121);
      _local_1c0 = _local_5a0;
      local_1a0 = vminps_avx(local_280,auVar140);
      auVar266._8_4_ = 0x7fffffff;
      auVar266._0_8_ = 0x7fffffff7fffffff;
      auVar266._12_4_ = 0x7fffffff;
      auVar266._16_4_ = 0x7fffffff;
      auVar266._20_4_ = 0x7fffffff;
      auVar266._24_4_ = 0x7fffffff;
      auVar266._28_4_ = 0x7fffffff;
      auVar112 = vandps_avx(ZEXT1632(auVar83),auVar266);
      _local_500 = vmaxps_avx(_local_5a0,auVar141);
      auVar259 = ZEXT3264(_local_500);
      _local_2a0 = _local_500;
      auVar172._8_4_ = 0x3e99999a;
      auVar172._0_8_ = 0x3e99999a3e99999a;
      auVar172._12_4_ = 0x3e99999a;
      auVar172._16_4_ = 0x3e99999a;
      auVar172._20_4_ = 0x3e99999a;
      auVar172._24_4_ = 0x3e99999a;
      auVar172._28_4_ = 0x3e99999a;
      uVar17 = vcmpps_avx512vl(auVar112,auVar172,1);
      uVar18 = vcmpps_avx512vl(_local_5a0,local_1a0,2);
      bVar61 = (byte)uVar18 & bVar59;
      uVar19 = vcmpps_avx512vl(_local_500,local_280,2);
      if ((bVar59 & ((byte)uVar19 | (byte)uVar18)) == 0) {
        auVar245 = ZEXT3264(_DAT_02020f20);
        auVar228 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar284 = ZEXT3264(_local_780);
      }
      else {
        auVar47._4_4_ = local_560._4_4_ * auVar278._4_4_;
        auVar47._0_4_ = local_560._0_4_ * auVar278._0_4_;
        auVar47._8_4_ = local_560._8_4_ * auVar278._8_4_;
        auVar47._12_4_ = local_560._12_4_ * auVar278._12_4_;
        auVar47._16_4_ = local_560._16_4_ * auVar278._16_4_;
        auVar47._20_4_ = local_560._20_4_ * auVar278._20_4_;
        auVar47._24_4_ = local_560._24_4_ * auVar278._24_4_;
        auVar47._28_4_ = 0x3e99999a;
        auVar83 = vfmadd213ps_fma(auVar122,local_540,auVar47);
        auVar83 = vfmadd213ps_fma(auVar120,local_520,ZEXT1632(auVar83));
        auVar112 = vandps_avx(ZEXT1632(auVar83),auVar266);
        uVar18 = vcmpps_avx512vl(auVar112,auVar172,1);
        bVar65 = (byte)uVar18 | ~bVar66;
        auVar173._8_4_ = 2;
        auVar173._0_8_ = 0x200000002;
        auVar173._12_4_ = 2;
        auVar173._16_4_ = 2;
        auVar173._20_4_ = 2;
        auVar173._24_4_ = 2;
        auVar173._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar112 = vpblendmd_avx512vl(auVar173,auVar33);
        local_260._0_4_ = (uint)(bVar65 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar65 & 1) * 2;
        bVar73 = (bool)(bVar65 >> 1 & 1);
        local_260._4_4_ = (uint)bVar73 * auVar112._4_4_ | (uint)!bVar73 * 2;
        bVar73 = (bool)(bVar65 >> 2 & 1);
        local_260._8_4_ = (uint)bVar73 * auVar112._8_4_ | (uint)!bVar73 * 2;
        bVar73 = (bool)(bVar65 >> 3 & 1);
        local_260._12_4_ = (uint)bVar73 * auVar112._12_4_ | (uint)!bVar73 * 2;
        bVar73 = (bool)(bVar65 >> 4 & 1);
        local_260._16_4_ = (uint)bVar73 * auVar112._16_4_ | (uint)!bVar73 * 2;
        bVar73 = (bool)(bVar65 >> 5 & 1);
        local_260._20_4_ = (uint)bVar73 * auVar112._20_4_ | (uint)!bVar73 * 2;
        bVar73 = (bool)(bVar65 >> 6 & 1);
        local_260._24_4_ = (uint)bVar73 * auVar112._24_4_ | (uint)!bVar73 * 2;
        local_260._28_4_ = (uint)(bVar65 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar65 >> 7) * 2;
        local_400 = vpbroadcastd_avx512vl();
        uVar18 = vpcmpd_avx512vl(local_400,local_260,5);
        bVar65 = (byte)uVar18 & bVar61;
        if (bVar65 != 0) {
          auVar84 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar83 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar16 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar85 = vminps_avx(auVar84,auVar16);
          auVar84 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar16 = vmaxps_avx(auVar83,auVar84);
          auVar83 = vandps_avx(auVar286,auVar85);
          auVar84 = vandps_avx(auVar286,auVar16);
          auVar83 = vmaxps_avx(auVar83,auVar84);
          auVar84 = vmovshdup_avx(auVar83);
          auVar84 = vmaxss_avx(auVar84,auVar83);
          auVar83 = vshufpd_avx(auVar83,auVar83,1);
          auVar83 = vmaxss_avx(auVar83,auVar84);
          fVar277 = auVar83._0_4_ * 1.9073486e-06;
          local_640 = vshufps_avx(auVar16,auVar16,0xff);
          local_4e0 = (float)local_5a0._0_4_ + (float)local_780._0_4_;
          fStack_4dc = (float)local_5a0._4_4_ + (float)local_780._4_4_;
          fStack_4d8 = fStack_598 + fStack_778;
          fStack_4d4 = fStack_594 + fStack_774;
          fStack_4d0 = fStack_590 + fStack_770;
          fStack_4cc = fStack_58c + fStack_76c;
          fStack_4c8 = fStack_588 + fStack_768;
          fStack_4c4 = fStack_584 + fStack_764;
          do {
            auVar174._8_4_ = 0x7f800000;
            auVar174._0_8_ = 0x7f8000007f800000;
            auVar174._12_4_ = 0x7f800000;
            auVar174._16_4_ = 0x7f800000;
            auVar174._20_4_ = 0x7f800000;
            auVar174._24_4_ = 0x7f800000;
            auVar174._28_4_ = 0x7f800000;
            auVar112 = vblendmps_avx512vl(auVar174,_local_5a0);
            auVar142._0_4_ =
                 (uint)(bVar65 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar65 & 1) * 0x7f800000;
            bVar73 = (bool)(bVar65 >> 1 & 1);
            auVar142._4_4_ = (uint)bVar73 * auVar112._4_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = (bool)(bVar65 >> 2 & 1);
            auVar142._8_4_ = (uint)bVar73 * auVar112._8_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = (bool)(bVar65 >> 3 & 1);
            auVar142._12_4_ = (uint)bVar73 * auVar112._12_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = (bool)(bVar65 >> 4 & 1);
            auVar142._16_4_ = (uint)bVar73 * auVar112._16_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = (bool)(bVar65 >> 5 & 1);
            auVar142._20_4_ = (uint)bVar73 * auVar112._20_4_ | (uint)!bVar73 * 0x7f800000;
            auVar142._24_4_ =
                 (uint)(bVar65 >> 6) * auVar112._24_4_ | (uint)!(bool)(bVar65 >> 6) * 0x7f800000;
            auVar142._28_4_ = 0x7f800000;
            auVar112 = vshufps_avx(auVar142,auVar142,0xb1);
            auVar112 = vminps_avx(auVar142,auVar112);
            auVar104 = vshufpd_avx(auVar112,auVar112,5);
            auVar112 = vminps_avx(auVar112,auVar104);
            auVar104 = vpermpd_avx2(auVar112,0x4e);
            auVar112 = vminps_avx(auVar112,auVar104);
            uVar18 = vcmpps_avx512vl(auVar142,auVar112,0);
            bVar60 = (byte)uVar18 & bVar65;
            bVar68 = bVar65;
            if (bVar60 != 0) {
              bVar68 = bVar60;
            }
            iVar20 = 0;
            for (uVar76 = (uint)bVar68; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            bVar68 = '\x01' << ((byte)iVar20 & 0x1f);
            uVar76 = *(uint *)(local_4a0 + (uint)(iVar20 << 2));
            uVar149 = *(uint *)(local_1c0 + (uint)(iVar20 << 2));
            fVar279 = auVar80._0_4_;
            if ((float)local_720._0_4_ < 0.0) {
              fVar279 = sqrtf((float)local_720._0_4_);
            }
            auVar228 = ZEXT464(uVar76);
            auVar276 = ZEXT464(uVar149);
            bVar60 = ~bVar68;
            lVar71 = 5;
            do {
              fVar280 = auVar276._0_4_;
              auVar162._4_4_ = fVar280;
              auVar162._0_4_ = fVar280;
              auVar162._8_4_ = fVar280;
              auVar162._12_4_ = fVar280;
              auVar83 = vfmadd132ps_fma(auVar162,ZEXT816(0) << 0x40,local_710);
              fVar283 = auVar228._0_4_;
              local_800._4_4_ = 1.0 - fVar283;
              fVar267 = (float)local_800._4_4_ * (float)local_800._4_4_ * (float)local_800._4_4_;
              fVar157 = fVar283 * fVar283 * fVar283;
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar267),
                                        ZEXT416((uint)fVar157));
              fVar281 = fVar283 * (float)local_800._4_4_;
              auVar82 = ZEXT416((uint)local_800._4_4_);
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar283 * fVar281 * 6.0)),
                                        ZEXT416((uint)(fVar281 * (float)local_800._4_4_)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar157),
                                        ZEXT416((uint)fVar267));
              auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar281 * (float)local_800._4_4_ * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar283 * fVar281)));
              fVar267 = fVar267 * 0.16666667;
              fVar268 = (auVar84._0_4_ + auVar85._0_4_) * 0.16666667;
              fVar282 = (auVar16._0_4_ + auVar87._0_4_) * 0.16666667;
              fVar157 = fVar157 * 0.16666667;
              auVar213._0_4_ = fVar157 * (float)local_700._0_4_;
              auVar213._4_4_ = fVar157 * (float)local_700._4_4_;
              auVar213._8_4_ = fVar157 * fStack_6f8;
              auVar213._12_4_ = fVar157 * fStack_6f4;
              auVar249._4_4_ = fVar282;
              auVar249._0_4_ = fVar282;
              auVar249._8_4_ = fVar282;
              auVar249._12_4_ = fVar282;
              auVar84 = vfmadd132ps_fma(auVar249,auVar213,local_6c0._0_16_);
              auVar214._4_4_ = fVar268;
              auVar214._0_4_ = fVar268;
              auVar214._8_4_ = fVar268;
              auVar214._12_4_ = fVar268;
              auVar84 = vfmadd132ps_fma(auVar214,auVar84,local_6e0._0_16_);
              auVar190._4_4_ = fVar267;
              auVar190._0_4_ = fVar267;
              auVar190._8_4_ = fVar267;
              auVar190._12_4_ = fVar267;
              auVar84 = vfmadd132ps_fma(auVar190,auVar84,local_6a0._0_16_);
              local_580._0_16_ = auVar84;
              auVar83 = vsubps_avx(auVar83,auVar84);
              local_740._0_16_ = auVar83;
              auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
              auVar84 = auVar228._0_16_;
              local_760._0_16_ = auVar83;
              if (auVar83._0_4_ < 0.0) {
                auVar278._0_4_ = sqrtf(auVar83._0_4_);
                auVar278._4_60_ = extraout_var;
                auVar83 = auVar278._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
              }
              local_800._0_4_ = local_800._4_4_;
              fStack_7f8 = (float)local_800._4_4_;
              fStack_7f4 = (float)local_800._4_4_;
              auVar85 = vfnmsub213ss_fma(auVar84,auVar84,ZEXT416((uint)(fVar281 * 4.0)));
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar281 * 4.0)),auVar82,auVar82);
              fVar281 = (float)local_800._4_4_ * -(float)local_800._4_4_ * 0.5;
              fVar267 = auVar85._0_4_ * 0.5;
              fVar268 = auVar16._0_4_ * 0.5;
              fVar282 = fVar283 * fVar283 * 0.5;
              auVar235._0_4_ = fVar282 * (float)local_700._0_4_;
              auVar235._4_4_ = fVar282 * (float)local_700._4_4_;
              auVar235._8_4_ = fVar282 * fStack_6f8;
              auVar235._12_4_ = fVar282 * fStack_6f4;
              auVar191._4_4_ = fVar268;
              auVar191._0_4_ = fVar268;
              auVar191._8_4_ = fVar268;
              auVar191._12_4_ = fVar268;
              auVar16 = vfmadd132ps_fma(auVar191,auVar235,local_6c0._0_16_);
              auVar215._4_4_ = fVar267;
              auVar215._0_4_ = fVar267;
              auVar215._8_4_ = fVar267;
              auVar215._12_4_ = fVar267;
              auVar16 = vfmadd132ps_fma(auVar215,auVar16,local_6e0._0_16_);
              auVar291._4_4_ = fVar281;
              auVar291._0_4_ = fVar281;
              auVar291._8_4_ = fVar281;
              auVar291._12_4_ = fVar281;
              auVar16 = vfmadd132ps_fma(auVar291,auVar16,local_6a0._0_16_);
              _local_5c0 = vdpps_avx(auVar16,auVar16,0x7f);
              auVar49._12_4_ = 0;
              auVar49._0_12_ = ZEXT812(0);
              fVar281 = local_5c0._0_4_;
              auVar85 = vrsqrt14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar281));
              fVar267 = auVar85._0_4_;
              local_5d0 = vrcp14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar281));
              auVar85 = vfnmadd213ss_fma(local_5d0,_local_5c0,ZEXT416(0x40000000));
              local_5e0._0_4_ = auVar85._0_4_;
              uVar76 = auVar83._0_4_;
              if (fVar281 < -fVar281) {
                fVar268 = sqrtf(fVar281);
                auVar83 = ZEXT416(uVar76);
              }
              else {
                auVar85 = vsqrtss_avx(_local_5c0,_local_5c0);
                fVar268 = auVar85._0_4_;
              }
              fVar281 = fVar267 * 1.5 + fVar281 * -0.5 * fVar267 * fVar267 * fVar267;
              auVar163._0_4_ = auVar16._0_4_ * fVar281;
              auVar163._4_4_ = auVar16._4_4_ * fVar281;
              auVar163._8_4_ = auVar16._8_4_ * fVar281;
              auVar163._12_4_ = auVar16._12_4_ * fVar281;
              auVar85 = vdpps_avx(local_740._0_16_,auVar163,0x7f);
              fVar282 = auVar83._0_4_;
              auVar164._0_4_ = auVar85._0_4_ * auVar85._0_4_;
              auVar164._4_4_ = auVar85._4_4_ * auVar85._4_4_;
              auVar164._8_4_ = auVar85._8_4_ * auVar85._8_4_;
              auVar164._12_4_ = auVar85._12_4_ * auVar85._12_4_;
              auVar86 = vsubps_avx512vl(local_760._0_16_,auVar164);
              fVar267 = auVar86._0_4_;
              auVar192._4_12_ = ZEXT812(0) << 0x20;
              auVar192._0_4_ = fVar267;
              auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar192);
              auVar88 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
              if (fVar267 < 0.0) {
                local_610._0_4_ = auVar88._0_4_;
                local_620 = fVar281;
                fStack_61c = fVar281;
                fStack_618 = fVar281;
                fStack_614 = fVar281;
                local_600 = auVar87;
                local_5f0 = auVar85;
                fVar157 = sqrtf(fVar267);
                auVar88 = ZEXT416((uint)local_610._0_4_);
                auVar83 = ZEXT416(uVar76);
                auVar85 = local_5f0;
                auVar87 = local_600;
                fVar281 = local_620;
                fVar254 = fStack_61c;
                fVar209 = fStack_618;
                fVar269 = fStack_614;
              }
              else {
                auVar86 = vsqrtss_avx(auVar86,auVar86);
                fVar157 = auVar86._0_4_;
                fVar254 = fVar281;
                fVar209 = fVar281;
                fVar269 = fVar281;
              }
              auVar292 = ZEXT1664(auVar16);
              auVar278 = ZEXT1664(local_740._0_16_);
              auVar286._8_4_ = 0x7fffffff;
              auVar286._0_8_ = 0x7fffffff7fffffff;
              auVar286._12_4_ = 0x7fffffff;
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar82,auVar84);
              auVar84 = vfmadd231ss_fma(auVar82,auVar84,SUB6416(ZEXT464(0xc0000000),0));
              auVar216._0_4_ = fVar283 * (float)local_700._0_4_;
              auVar216._4_4_ = fVar283 * (float)local_700._4_4_;
              auVar216._8_4_ = fVar283 * fStack_6f8;
              auVar216._12_4_ = fVar283 * fStack_6f4;
              auVar236._0_4_ = auVar84._0_4_;
              auVar236._4_4_ = auVar236._0_4_;
              auVar236._8_4_ = auVar236._0_4_;
              auVar236._12_4_ = auVar236._0_4_;
              auVar84 = vfmadd132ps_fma(auVar236,auVar216,local_6c0._0_16_);
              auVar193._0_4_ = auVar86._0_4_;
              auVar193._4_4_ = auVar193._0_4_;
              auVar193._8_4_ = auVar193._0_4_;
              auVar193._12_4_ = auVar193._0_4_;
              auVar84 = vfmadd132ps_fma(auVar193,auVar84,local_6e0._0_16_);
              auVar84 = vfmadd132ps_fma(_local_800,auVar84,local_6a0._0_16_);
              auVar194._0_4_ = auVar84._0_4_ * (float)local_5c0._0_4_;
              auVar194._4_4_ = auVar84._4_4_ * (float)local_5c0._0_4_;
              auVar194._8_4_ = auVar84._8_4_ * (float)local_5c0._0_4_;
              auVar194._12_4_ = auVar84._12_4_ * (float)local_5c0._0_4_;
              auVar84 = vdpps_avx(auVar16,auVar84,0x7f);
              fVar288 = auVar84._0_4_;
              auVar217._0_4_ = auVar16._0_4_ * fVar288;
              auVar217._4_4_ = auVar16._4_4_ * fVar288;
              auVar217._8_4_ = auVar16._8_4_ * fVar288;
              auVar217._12_4_ = auVar16._12_4_ * fVar288;
              auVar84 = vsubps_avx(auVar194,auVar217);
              fVar288 = (float)local_5e0._0_4_ * (float)local_5d0._0_4_;
              auVar82 = vmaxss_avx(ZEXT416((uint)fVar277),
                                   ZEXT416((uint)(fVar280 * fVar279 * 1.9073486e-06)));
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar144._16_16_ = auVar103._16_16_;
              auVar89 = vxorps_avx512vl(auVar16,auVar26);
              auVar218._0_4_ = fVar281 * auVar84._0_4_ * fVar288;
              auVar218._4_4_ = fVar254 * auVar84._4_4_ * fVar288;
              auVar218._8_4_ = fVar209 * auVar84._8_4_ * fVar288;
              auVar218._12_4_ = fVar269 * auVar84._12_4_ * fVar288;
              auVar289 = ZEXT1664(auVar163);
              auVar84 = vdpps_avx(auVar89,auVar163,0x7f);
              auVar86 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar277),auVar82);
              auVar83 = vdpps_avx(local_740._0_16_,auVar218,0x7f);
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(fVar282 + 1.0)),
                                        ZEXT416((uint)(fVar277 / fVar268)),auVar86);
              fVar281 = auVar84._0_4_ + auVar83._0_4_;
              auVar83 = vdpps_avx(local_710,auVar163,0x7f);
              auVar84 = vdpps_avx(local_740._0_16_,auVar89,0x7f);
              auVar89 = vmulss_avx512f(auVar87,ZEXT416((uint)(fVar267 * -0.5)));
              auVar87 = vmulss_avx512f(auVar87,auVar87);
              auVar90 = vaddss_avx512f(auVar88,ZEXT416((uint)(auVar89._0_4_ * auVar87._0_4_)));
              auVar87 = vdpps_avx(local_740._0_16_,local_710,0x7f);
              auVar88 = vfnmadd231ss_fma(auVar84,auVar85,ZEXT416((uint)fVar281));
              auVar89 = vfnmadd231ss_fma(auVar87,auVar85,auVar83);
              auVar84 = vpermilps_avx(local_580._0_16_,0xff);
              fVar157 = fVar157 - auVar84._0_4_;
              auVar84 = vshufps_avx(auVar16,auVar16,0xff);
              auVar87 = vfmsub213ss_fma(auVar88,auVar90,auVar84);
              fVar267 = auVar89._0_4_ * auVar90._0_4_;
              auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar87._0_4_)),
                                        ZEXT416((uint)fVar281),ZEXT416((uint)fVar267));
              fVar268 = auVar88._0_4_;
              fVar267 = auVar85._0_4_ * (fVar267 / fVar268) - fVar157 * (auVar83._0_4_ / fVar268);
              auVar259 = ZEXT464((uint)fVar267);
              fVar283 = fVar283 - fVar267;
              auVar228 = ZEXT464((uint)fVar283);
              fVar280 = fVar280 - (fVar157 * (fVar281 / fVar268) -
                                  auVar85._0_4_ * (auVar87._0_4_ / fVar268));
              auVar276 = ZEXT464((uint)fVar280);
              auVar83 = vandps_avx(auVar85,auVar286);
              bVar73 = true;
              if (auVar83._0_4_ < auVar86._0_4_) {
                auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar86._0_4_ + auVar82._0_4_)),local_640,
                                          ZEXT416(0x36000000));
                auVar83 = vandps_avx(auVar286,ZEXT416((uint)fVar157));
                if (auVar83._0_4_ < auVar85._0_4_) {
                  fVar280 = fVar280 + (float)local_630._0_4_;
                  auVar276 = ZEXT464((uint)fVar280);
                  if ((((fVar179 <= fVar280) &&
                       (fVar281 = *(float *)(ray + k * 4 + 0x100), fVar280 <= fVar281)) &&
                      (0.0 <= fVar283)) && (fVar283 <= 1.0)) {
                    auVar144._0_16_ = ZEXT816(0) << 0x20;
                    auVar143._4_28_ = auVar144._4_28_;
                    auVar143._0_4_ = local_760._0_4_;
                    auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar143._0_16_);
                    fVar268 = auVar83._0_4_;
                    auVar83 = vmulss_avx512f(local_760._0_16_,ZEXT416(0xbf000000));
                    pGVar4 = (context->scene->geometries).items[uVar63].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar68 = true;
                      }
                      else {
                        fVar268 = fVar268 * 1.5 + auVar83._0_4_ * fVar268 * fVar268 * fVar268;
                        auVar195._0_4_ = local_740._0_4_ * fVar268;
                        auVar195._4_4_ = local_740._4_4_ * fVar268;
                        auVar195._8_4_ = local_740._8_4_ * fVar268;
                        auVar195._12_4_ = local_740._12_4_ * fVar268;
                        auVar87 = vfmadd213ps_fma(auVar84,auVar195,auVar16);
                        auVar83 = vshufps_avx(auVar195,auVar195,0xc9);
                        auVar84 = vshufps_avx(auVar16,auVar16,0xc9);
                        auVar196._0_4_ = auVar195._0_4_ * auVar84._0_4_;
                        auVar196._4_4_ = auVar195._4_4_ * auVar84._4_4_;
                        auVar196._8_4_ = auVar195._8_4_ * auVar84._8_4_;
                        auVar196._12_4_ = auVar195._12_4_ * auVar84._12_4_;
                        auVar85 = vfmsub231ps_fma(auVar196,auVar16,auVar83);
                        auVar83 = vshufps_avx(auVar85,auVar85,0xc9);
                        auVar84 = vshufps_avx(auVar87,auVar87,0xc9);
                        auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
                        auVar165._0_4_ = auVar87._0_4_ * auVar85._0_4_;
                        auVar165._4_4_ = auVar87._4_4_ * auVar85._4_4_;
                        auVar165._8_4_ = auVar87._8_4_ * auVar85._8_4_;
                        auVar165._12_4_ = auVar87._12_4_ * auVar85._12_4_;
                        auVar83 = vfmsub231ps_fma(auVar165,auVar83,auVar84);
                        auVar225._8_4_ = 1;
                        auVar225._0_8_ = 0x100000001;
                        auVar225._12_4_ = 1;
                        auVar225._16_4_ = 1;
                        auVar225._20_4_ = 1;
                        auVar225._24_4_ = 1;
                        auVar225._28_4_ = 1;
                        auVar112 = vpermps_avx2(auVar225,ZEXT1632(auVar83));
                        auVar242._8_4_ = 2;
                        auVar242._0_8_ = 0x200000002;
                        auVar242._12_4_ = 2;
                        auVar242._16_4_ = 2;
                        auVar242._20_4_ = 2;
                        auVar242._24_4_ = 2;
                        auVar242._28_4_ = 2;
                        local_3a0 = vpermps_avx2(auVar242,ZEXT1632(auVar83));
                        local_380 = auVar83._0_4_;
                        local_3c0[0] = (RTCHitN)auVar112[0];
                        local_3c0[1] = (RTCHitN)auVar112[1];
                        local_3c0[2] = (RTCHitN)auVar112[2];
                        local_3c0[3] = (RTCHitN)auVar112[3];
                        local_3c0[4] = (RTCHitN)auVar112[4];
                        local_3c0[5] = (RTCHitN)auVar112[5];
                        local_3c0[6] = (RTCHitN)auVar112[6];
                        local_3c0[7] = (RTCHitN)auVar112[7];
                        local_3c0[8] = (RTCHitN)auVar112[8];
                        local_3c0[9] = (RTCHitN)auVar112[9];
                        local_3c0[10] = (RTCHitN)auVar112[10];
                        local_3c0[0xb] = (RTCHitN)auVar112[0xb];
                        local_3c0[0xc] = (RTCHitN)auVar112[0xc];
                        local_3c0[0xd] = (RTCHitN)auVar112[0xd];
                        local_3c0[0xe] = (RTCHitN)auVar112[0xe];
                        local_3c0[0xf] = (RTCHitN)auVar112[0xf];
                        local_3c0[0x10] = (RTCHitN)auVar112[0x10];
                        local_3c0[0x11] = (RTCHitN)auVar112[0x11];
                        local_3c0[0x12] = (RTCHitN)auVar112[0x12];
                        local_3c0[0x13] = (RTCHitN)auVar112[0x13];
                        local_3c0[0x14] = (RTCHitN)auVar112[0x14];
                        local_3c0[0x15] = (RTCHitN)auVar112[0x15];
                        local_3c0[0x16] = (RTCHitN)auVar112[0x16];
                        local_3c0[0x17] = (RTCHitN)auVar112[0x17];
                        local_3c0[0x18] = (RTCHitN)auVar112[0x18];
                        local_3c0[0x19] = (RTCHitN)auVar112[0x19];
                        local_3c0[0x1a] = (RTCHitN)auVar112[0x1a];
                        local_3c0[0x1b] = (RTCHitN)auVar112[0x1b];
                        local_3c0[0x1c] = (RTCHitN)auVar112[0x1c];
                        local_3c0[0x1d] = (RTCHitN)auVar112[0x1d];
                        local_3c0[0x1e] = (RTCHitN)auVar112[0x1e];
                        local_3c0[0x1f] = (RTCHitN)auVar112[0x1f];
                        uStack_37c = local_380;
                        uStack_378 = local_380;
                        uStack_374 = local_380;
                        uStack_370 = local_380;
                        uStack_36c = local_380;
                        uStack_368 = local_380;
                        uStack_364 = local_380;
                        local_360 = fVar283;
                        fStack_35c = fVar283;
                        fStack_358 = fVar283;
                        fStack_354 = fVar283;
                        fStack_350 = fVar283;
                        fStack_34c = fVar283;
                        fStack_348 = fVar283;
                        fStack_344 = fVar283;
                        local_340 = ZEXT432(0) << 0x20;
                        local_320 = local_420._0_8_;
                        uStack_318 = local_420._8_8_;
                        uStack_310 = local_420._16_8_;
                        uStack_308 = local_420._24_8_;
                        local_300 = local_440;
                        vpcmpeqd_avx2(local_440,local_440);
                        local_2e0 = context->user->instID[0];
                        uStack_2dc = local_2e0;
                        uStack_2d8 = local_2e0;
                        uStack_2d4 = local_2e0;
                        uStack_2d0 = local_2e0;
                        uStack_2cc = local_2e0;
                        uStack_2c8 = local_2e0;
                        uStack_2c4 = local_2e0;
                        local_2c0 = context->user->instPrimID[0];
                        uStack_2bc = local_2c0;
                        uStack_2b8 = local_2c0;
                        uStack_2b4 = local_2c0;
                        uStack_2b0 = local_2c0;
                        uStack_2ac = local_2c0;
                        uStack_2a8 = local_2c0;
                        uStack_2a4 = local_2c0;
                        *(float *)(ray + k * 4 + 0x100) = fVar280;
                        local_680 = local_460._0_8_;
                        uStack_678 = local_460._8_8_;
                        uStack_670 = local_460._16_8_;
                        uStack_668 = local_460._24_8_;
                        local_7d0.valid = (int *)&local_680;
                        local_7d0.geometryUserPtr = pGVar4->userPtr;
                        local_7d0.context = context->user;
                        local_7d0.hit = local_3c0;
                        local_7d0.N = 8;
                        local_7d0.ray = (RTCRayN *)ray;
                        if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar259 = ZEXT464((uint)fVar267);
                          auVar278 = ZEXT1664(local_740._0_16_);
                          auVar289 = ZEXT1664(auVar163);
                          auVar292 = ZEXT1664(auVar16);
                          (*pGVar4->occlusionFilterN)(&local_7d0);
                          auVar276 = ZEXT1664(ZEXT416((uint)fVar280));
                          auVar228 = ZEXT1664(ZEXT416((uint)fVar283));
                          auVar286._8_4_ = 0x7fffffff;
                          auVar286._0_8_ = 0x7fffffff7fffffff;
                          auVar286._12_4_ = 0x7fffffff;
                        }
                        auVar52._8_8_ = uStack_678;
                        auVar52._0_8_ = local_680;
                        auVar52._16_8_ = uStack_670;
                        auVar52._24_8_ = uStack_668;
                        if (auVar52 == (undefined1  [32])0x0) {
                          bVar68 = false;
                        }
                        else {
                          p_Var8 = context->args->filter;
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar259 = ZEXT1664(auVar259._0_16_);
                            auVar278 = ZEXT1664(auVar278._0_16_);
                            auVar289 = ZEXT1664(auVar289._0_16_);
                            auVar292 = ZEXT1664(auVar292._0_16_);
                            (*p_Var8)(&local_7d0);
                            auVar276 = ZEXT1664(ZEXT416((uint)fVar280));
                            auVar228 = ZEXT1664(ZEXT416((uint)fVar283));
                            auVar286._8_4_ = 0x7fffffff;
                            auVar286._0_8_ = 0x7fffffff7fffffff;
                            auVar286._12_4_ = 0x7fffffff;
                          }
                          auVar53._8_8_ = uStack_678;
                          auVar53._0_8_ = local_680;
                          auVar53._16_8_ = uStack_670;
                          auVar53._24_8_ = uStack_668;
                          uVar75 = vptestmd_avx512vl(auVar53,auVar53);
                          auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar73 = (bool)((byte)uVar75 & 1);
                          bVar9 = (bool)((byte)(uVar75 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar75 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar75 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar75 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar75 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar75 >> 6) & 1);
                          bVar15 = SUB81(uVar75 >> 7,0);
                          *(uint *)(local_7d0.ray + 0x100) =
                               (uint)bVar73 * auVar112._0_4_ |
                               (uint)!bVar73 * *(int *)(local_7d0.ray + 0x100);
                          *(uint *)(local_7d0.ray + 0x104) =
                               (uint)bVar9 * auVar112._4_4_ |
                               (uint)!bVar9 * *(int *)(local_7d0.ray + 0x104);
                          *(uint *)(local_7d0.ray + 0x108) =
                               (uint)bVar10 * auVar112._8_4_ |
                               (uint)!bVar10 * *(int *)(local_7d0.ray + 0x108);
                          *(uint *)(local_7d0.ray + 0x10c) =
                               (uint)bVar11 * auVar112._12_4_ |
                               (uint)!bVar11 * *(int *)(local_7d0.ray + 0x10c);
                          *(uint *)(local_7d0.ray + 0x110) =
                               (uint)bVar12 * auVar112._16_4_ |
                               (uint)!bVar12 * *(int *)(local_7d0.ray + 0x110);
                          *(uint *)(local_7d0.ray + 0x114) =
                               (uint)bVar13 * auVar112._20_4_ |
                               (uint)!bVar13 * *(int *)(local_7d0.ray + 0x114);
                          *(uint *)(local_7d0.ray + 0x118) =
                               (uint)bVar14 * auVar112._24_4_ |
                               (uint)!bVar14 * *(int *)(local_7d0.ray + 0x118);
                          *(uint *)(local_7d0.ray + 0x11c) =
                               (uint)bVar15 * auVar112._28_4_ |
                               (uint)!bVar15 * *(int *)(local_7d0.ray + 0x11c);
                          bVar68 = auVar53 != (undefined1  [32])0x0;
                        }
                        if ((bool)bVar68 == false) {
                          *(float *)(ray + k * 4 + 0x100) = fVar281;
                        }
                      }
                      bVar73 = false;
                      goto LAB_01c3cd03;
                    }
                  }
                  bVar73 = false;
                  bVar68 = 0;
                }
              }
LAB_01c3cd03:
              if (!bVar73) goto LAB_01c3d0f4;
              lVar71 = lVar71 + -1;
            } while (lVar71 != 0);
            bVar68 = 0;
LAB_01c3d0f4:
            bVar67 = bVar67 | bVar68 & 1;
            auVar56._4_4_ = fStack_4dc;
            auVar56._0_4_ = local_4e0;
            auVar56._8_4_ = fStack_4d8;
            auVar56._12_4_ = fStack_4d4;
            auVar56._16_4_ = fStack_4d0;
            auVar56._20_4_ = fStack_4cc;
            auVar56._24_4_ = fStack_4c8;
            auVar56._28_4_ = fStack_4c4;
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar34._4_4_ = uVar2;
            auVar34._0_4_ = uVar2;
            auVar34._8_4_ = uVar2;
            auVar34._12_4_ = uVar2;
            auVar34._16_4_ = uVar2;
            auVar34._20_4_ = uVar2;
            auVar34._24_4_ = uVar2;
            auVar34._28_4_ = uVar2;
            uVar18 = vcmpps_avx512vl(auVar56,auVar34,2);
            bVar65 = bVar60 & bVar65 & (byte)uVar18;
          } while (bVar65 != 0);
        }
        auVar284 = ZEXT3264(_local_780);
        auVar175._0_4_ = local_780._0_4_ + (float)local_500._0_4_;
        auVar175._4_4_ = local_780._4_4_ + (float)local_500._4_4_;
        auVar175._8_4_ = local_780._8_4_ + fStack_4f8;
        auVar175._12_4_ = local_780._12_4_ + fStack_4f4;
        auVar175._16_4_ = local_780._16_4_ + fStack_4f0;
        auVar175._20_4_ = local_780._20_4_ + fStack_4ec;
        auVar175._24_4_ = local_780._24_4_ + fStack_4e8;
        auVar175._28_4_ = local_780._28_4_ + fStack_4e4;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar35._4_4_ = uVar2;
        auVar35._0_4_ = uVar2;
        auVar35._8_4_ = uVar2;
        auVar35._12_4_ = uVar2;
        auVar35._16_4_ = uVar2;
        auVar35._20_4_ = uVar2;
        auVar35._24_4_ = uVar2;
        auVar35._28_4_ = uVar2;
        uVar18 = vcmpps_avx512vl(auVar175,auVar35,2);
        bVar66 = (byte)uVar17 | ~bVar66;
        bVar59 = (byte)uVar19 & bVar59 & (byte)uVar18;
        auVar176._8_4_ = 2;
        auVar176._0_8_ = 0x200000002;
        auVar176._12_4_ = 2;
        auVar176._16_4_ = 2;
        auVar176._20_4_ = 2;
        auVar176._24_4_ = 2;
        auVar176._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar112 = vpblendmd_avx512vl(auVar176,auVar36);
        local_500._0_4_ = (uint)(bVar66 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar66 & 1) * 2;
        bVar73 = (bool)(bVar66 >> 1 & 1);
        local_500._4_4_ = (uint)bVar73 * auVar112._4_4_ | (uint)!bVar73 * 2;
        bVar73 = (bool)(bVar66 >> 2 & 1);
        fStack_4f8 = (float)((uint)bVar73 * auVar112._8_4_ | (uint)!bVar73 * 2);
        bVar73 = (bool)(bVar66 >> 3 & 1);
        fStack_4f4 = (float)((uint)bVar73 * auVar112._12_4_ | (uint)!bVar73 * 2);
        bVar73 = (bool)(bVar66 >> 4 & 1);
        fStack_4f0 = (float)((uint)bVar73 * auVar112._16_4_ | (uint)!bVar73 * 2);
        bVar73 = (bool)(bVar66 >> 5 & 1);
        fStack_4ec = (float)((uint)bVar73 * auVar112._20_4_ | (uint)!bVar73 * 2);
        bVar73 = (bool)(bVar66 >> 6 & 1);
        fStack_4e8 = (float)((uint)bVar73 * auVar112._24_4_ | (uint)!bVar73 * 2);
        fStack_4e4 = (float)((uint)(bVar66 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar66 >> 7) * 2)
        ;
        uVar17 = vpcmpd_avx512vl(_local_500,local_400,2);
        bVar66 = (byte)uVar17 & bVar59;
        if (bVar66 == 0) {
          auVar297 = ZEXT3264(local_7a0);
        }
        else {
          auVar84 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar83 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar16 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar85 = vminps_avx(auVar84,auVar16);
          auVar84 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar16 = vmaxps_avx(auVar83,auVar84);
          auVar83 = vandps_avx(auVar286,auVar85);
          auVar84 = vandps_avx(auVar286,auVar16);
          auVar83 = vmaxps_avx(auVar83,auVar84);
          auVar84 = vmovshdup_avx(auVar83);
          auVar84 = vmaxss_avx(auVar84,auVar83);
          auVar83 = vshufpd_avx(auVar83,auVar83,1);
          auVar83 = vmaxss_avx(auVar83,auVar84);
          local_5f0._0_4_ = auVar83._0_4_ * 1.9073486e-06;
          local_640 = vshufps_avx(auVar16,auVar16,0xff);
          _local_5a0 = _local_2a0;
          local_4e0 = local_780._0_4_ + (float)local_2a0._0_4_;
          fStack_4dc = local_780._4_4_ + (float)local_2a0._4_4_;
          fStack_4d8 = local_780._8_4_ + fStack_298;
          fStack_4d4 = local_780._12_4_ + fStack_294;
          fStack_4d0 = local_780._16_4_ + fStack_290;
          fStack_4cc = local_780._20_4_ + fStack_28c;
          fStack_4c8 = local_780._24_4_ + fStack_288;
          fStack_4c4 = local_780._28_4_ + fStack_284;
          do {
            auVar177._8_4_ = 0x7f800000;
            auVar177._0_8_ = 0x7f8000007f800000;
            auVar177._12_4_ = 0x7f800000;
            auVar177._16_4_ = 0x7f800000;
            auVar177._20_4_ = 0x7f800000;
            auVar177._24_4_ = 0x7f800000;
            auVar177._28_4_ = 0x7f800000;
            auVar112 = vblendmps_avx512vl(auVar177,_local_5a0);
            auVar145._0_4_ =
                 (uint)(bVar66 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar66 & 1) * 0x7f800000;
            bVar73 = (bool)(bVar66 >> 1 & 1);
            auVar145._4_4_ = (uint)bVar73 * auVar112._4_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = (bool)(bVar66 >> 2 & 1);
            auVar145._8_4_ = (uint)bVar73 * auVar112._8_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = (bool)(bVar66 >> 3 & 1);
            auVar145._12_4_ = (uint)bVar73 * auVar112._12_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = (bool)(bVar66 >> 4 & 1);
            auVar145._16_4_ = (uint)bVar73 * auVar112._16_4_ | (uint)!bVar73 * 0x7f800000;
            bVar73 = (bool)(bVar66 >> 5 & 1);
            auVar145._20_4_ = (uint)bVar73 * auVar112._20_4_ | (uint)!bVar73 * 0x7f800000;
            auVar145._24_4_ =
                 (uint)(bVar66 >> 6) * auVar112._24_4_ | (uint)!(bool)(bVar66 >> 6) * 0x7f800000;
            auVar145._28_4_ = 0x7f800000;
            auVar112 = vshufps_avx(auVar145,auVar145,0xb1);
            auVar112 = vminps_avx(auVar145,auVar112);
            auVar104 = vshufpd_avx(auVar112,auVar112,5);
            auVar112 = vminps_avx(auVar112,auVar104);
            auVar104 = vpermpd_avx2(auVar112,0x4e);
            auVar112 = vminps_avx(auVar112,auVar104);
            uVar17 = vcmpps_avx512vl(auVar145,auVar112,0);
            bVar68 = (byte)uVar17 & bVar66;
            bVar65 = bVar66;
            if (bVar68 != 0) {
              bVar65 = bVar68;
            }
            iVar20 = 0;
            for (uVar76 = (uint)bVar65; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            bVar65 = '\x01' << ((byte)iVar20 & 0x1f);
            uVar76 = *(uint *)(local_4c0 + (uint)(iVar20 << 2));
            uVar149 = *(uint *)(local_280 + (uint)(iVar20 << 2));
            fVar277 = auVar81._0_4_;
            if ((float)local_720._0_4_ < 0.0) {
              fVar277 = sqrtf((float)local_720._0_4_);
            }
            auVar289 = ZEXT464(uVar149);
            auVar228 = ZEXT464(uVar76);
            bVar68 = ~bVar65;
            lVar71 = 5;
            do {
              fVar279 = auVar289._0_4_;
              auVar166._4_4_ = fVar279;
              auVar166._0_4_ = fVar279;
              auVar166._8_4_ = fVar279;
              auVar166._12_4_ = fVar279;
              auVar83 = vfmadd132ps_fma(auVar166,ZEXT816(0) << 0x40,local_710);
              fVar283 = auVar228._0_4_;
              fVar157 = 1.0 - fVar283;
              fVar281 = fVar157 * fVar157 * fVar157;
              fVar282 = fVar283 * fVar283 * fVar283;
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar281),
                                        ZEXT416((uint)fVar282));
              fVar280 = fVar283 * fVar157;
              auVar82 = ZEXT416((uint)fVar157);
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar283 * fVar280 * 6.0)),
                                        ZEXT416((uint)(fVar280 * fVar157)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar282),
                                        ZEXT416((uint)fVar281));
              auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar280 * fVar157 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar283 * fVar280)));
              fVar281 = fVar281 * 0.16666667;
              fVar267 = (auVar84._0_4_ + auVar85._0_4_) * 0.16666667;
              fVar268 = (auVar16._0_4_ + auVar87._0_4_) * 0.16666667;
              fVar282 = fVar282 * 0.16666667;
              auVar219._0_4_ = fVar282 * (float)local_700._0_4_;
              auVar219._4_4_ = fVar282 * (float)local_700._4_4_;
              auVar219._8_4_ = fVar282 * fStack_6f8;
              auVar219._12_4_ = fVar282 * fStack_6f4;
              auVar250._4_4_ = fVar268;
              auVar250._0_4_ = fVar268;
              auVar250._8_4_ = fVar268;
              auVar250._12_4_ = fVar268;
              auVar84 = vfmadd132ps_fma(auVar250,auVar219,local_6c0._0_16_);
              auVar220._4_4_ = fVar267;
              auVar220._0_4_ = fVar267;
              auVar220._8_4_ = fVar267;
              auVar220._12_4_ = fVar267;
              auVar84 = vfmadd132ps_fma(auVar220,auVar84,local_6e0._0_16_);
              auVar197._4_4_ = fVar281;
              auVar197._0_4_ = fVar281;
              auVar197._8_4_ = fVar281;
              auVar197._12_4_ = fVar281;
              auVar84 = vfmadd132ps_fma(auVar197,auVar84,local_6a0._0_16_);
              local_580._0_16_ = auVar84;
              auVar83 = vsubps_avx(auVar83,auVar84);
              local_740._0_16_ = auVar83;
              auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
              auVar84 = auVar228._0_16_;
              local_760._0_16_ = auVar83;
              if (auVar83._0_4_ < 0.0) {
                auVar259._0_4_ = sqrtf(auVar83._0_4_);
                auVar259._4_60_ = extraout_var_00;
                auVar83 = auVar259._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
              }
              local_5c0._4_4_ = fVar157;
              local_5c0._0_4_ = fVar157;
              fStack_5b8 = fVar157;
              fStack_5b4 = fVar157;
              auVar85 = vfnmsub213ss_fma(auVar84,auVar84,ZEXT416((uint)(fVar280 * 4.0)));
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar280 * 4.0)),auVar82,auVar82);
              fVar280 = fVar157 * -fVar157 * 0.5;
              fVar281 = auVar85._0_4_ * 0.5;
              fVar267 = auVar16._0_4_ * 0.5;
              fVar268 = fVar283 * fVar283 * 0.5;
              auVar237._0_4_ = fVar268 * (float)local_700._0_4_;
              auVar237._4_4_ = fVar268 * (float)local_700._4_4_;
              auVar237._8_4_ = fVar268 * fStack_6f8;
              auVar237._12_4_ = fVar268 * fStack_6f4;
              auVar198._4_4_ = fVar267;
              auVar198._0_4_ = fVar267;
              auVar198._8_4_ = fVar267;
              auVar198._12_4_ = fVar267;
              auVar16 = vfmadd132ps_fma(auVar198,auVar237,local_6c0._0_16_);
              auVar221._4_4_ = fVar281;
              auVar221._0_4_ = fVar281;
              auVar221._8_4_ = fVar281;
              auVar221._12_4_ = fVar281;
              auVar16 = vfmadd132ps_fma(auVar221,auVar16,local_6e0._0_16_);
              auVar296._4_4_ = fVar280;
              auVar296._0_4_ = fVar280;
              auVar296._8_4_ = fVar280;
              auVar296._12_4_ = fVar280;
              auVar16 = vfmadd132ps_fma(auVar296,auVar16,local_6a0._0_16_);
              local_5d0 = vdpps_avx(auVar16,auVar16,0x7f);
              auVar50._12_4_ = 0;
              auVar50._0_12_ = ZEXT812(0);
              fVar280 = local_5d0._0_4_;
              auVar85 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar280));
              fVar281 = auVar85._0_4_;
              local_5e0 = vrcp14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar280));
              auVar85 = vfnmadd213ss_fma(local_5e0,local_5d0,ZEXT416(0x40000000));
              uVar76 = auVar83._0_4_;
              if (fVar280 < -fVar280) {
                fVar267 = sqrtf(fVar280);
                auVar83 = ZEXT416(uVar76);
              }
              else {
                auVar87 = vsqrtss_avx(local_5d0,local_5d0);
                fVar267 = auVar87._0_4_;
              }
              fVar280 = fVar281 * 1.5 + fVar280 * -0.5 * fVar281 * fVar281 * fVar281;
              auVar167._0_4_ = auVar16._0_4_ * fVar280;
              auVar167._4_4_ = auVar16._4_4_ * fVar280;
              auVar167._8_4_ = auVar16._8_4_ * fVar280;
              auVar167._12_4_ = auVar16._12_4_ * fVar280;
              auVar87 = vdpps_avx(local_740._0_16_,auVar167,0x7f);
              auVar89 = vaddss_avx512f(auVar83,ZEXT416(0x3f800000));
              auVar168._0_4_ = auVar87._0_4_ * auVar87._0_4_;
              auVar168._4_4_ = auVar87._4_4_ * auVar87._4_4_;
              auVar168._8_4_ = auVar87._8_4_ * auVar87._8_4_;
              auVar168._12_4_ = auVar87._12_4_ * auVar87._12_4_;
              auVar86 = vsubps_avx(local_760._0_16_,auVar168);
              fVar281 = auVar86._0_4_;
              auVar199._4_12_ = ZEXT812(0) << 0x20;
              auVar199._0_4_ = fVar281;
              auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar199);
              auVar90 = vmulss_avx512f(auVar88,ZEXT416(0x3fc00000));
              uVar74 = fVar281 == 0.0;
              uVar72 = fVar281 < 0.0;
              if ((bool)uVar72) {
                local_600._0_4_ = fVar267;
                local_620 = fVar280;
                fStack_61c = fVar280;
                fStack_618 = fVar280;
                fStack_614 = fVar280;
                local_610 = auVar88;
                fVar268 = sqrtf(fVar281);
                auVar89 = ZEXT416(auVar89._0_4_);
                auVar83 = ZEXT416(uVar76);
                auVar88 = local_610;
                fVar280 = local_620;
                fVar282 = fStack_61c;
                fVar157 = fStack_618;
                fVar254 = fStack_614;
                fVar267 = (float)local_600._0_4_;
              }
              else {
                auVar86 = vsqrtss_avx(auVar86,auVar86);
                fVar268 = auVar86._0_4_;
                fVar282 = fVar280;
                fVar157 = fVar280;
                fVar254 = fVar280;
              }
              auVar292 = ZEXT1664(local_740._0_16_);
              auVar275._8_4_ = 0x7fffffff;
              auVar275._0_8_ = 0x7fffffff7fffffff;
              auVar275._12_4_ = 0x7fffffff;
              auVar276 = ZEXT1664(auVar275);
              auVar284 = ZEXT3264(_local_780);
              auVar297 = ZEXT3264(local_7a0);
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar82,auVar84);
              auVar84 = vfmadd231ss_fma(auVar82,auVar84,SUB6416(ZEXT464(0xc0000000),0));
              auVar222._0_4_ = fVar283 * (float)local_700._0_4_;
              auVar222._4_4_ = fVar283 * (float)local_700._4_4_;
              auVar222._8_4_ = fVar283 * fStack_6f8;
              auVar222._12_4_ = fVar283 * fStack_6f4;
              auVar238._0_4_ = auVar84._0_4_;
              auVar238._4_4_ = auVar238._0_4_;
              auVar238._8_4_ = auVar238._0_4_;
              auVar238._12_4_ = auVar238._0_4_;
              auVar84 = vfmadd132ps_fma(auVar238,auVar222,local_6c0._0_16_);
              auVar200._0_4_ = auVar86._0_4_;
              auVar200._4_4_ = auVar200._0_4_;
              auVar200._8_4_ = auVar200._0_4_;
              auVar200._12_4_ = auVar200._0_4_;
              auVar84 = vfmadd132ps_fma(auVar200,auVar84,local_6e0._0_16_);
              auVar84 = vfmadd132ps_fma(_local_5c0,auVar84,local_6a0._0_16_);
              auVar201._0_4_ = auVar84._0_4_ * (float)local_5d0._0_4_;
              auVar201._4_4_ = auVar84._4_4_ * (float)local_5d0._0_4_;
              auVar201._8_4_ = auVar84._8_4_ * (float)local_5d0._0_4_;
              auVar201._12_4_ = auVar84._12_4_ * (float)local_5d0._0_4_;
              auVar84 = vdpps_avx(auVar16,auVar84,0x7f);
              fVar209 = auVar84._0_4_;
              auVar223._0_4_ = auVar16._0_4_ * fVar209;
              auVar223._4_4_ = auVar16._4_4_ * fVar209;
              auVar223._8_4_ = auVar16._8_4_ * fVar209;
              auVar223._12_4_ = auVar16._12_4_ * fVar209;
              auVar84 = vsubps_avx(auVar201,auVar223);
              fVar209 = auVar85._0_4_ * (float)local_5e0._0_4_;
              auVar82 = vmaxss_avx(ZEXT416((uint)local_5f0._0_4_),
                                   ZEXT416((uint)(fVar279 * fVar277 * 1.9073486e-06)));
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar86 = vxorps_avx512vl(auVar16,auVar27);
              auVar224._0_4_ = fVar280 * auVar84._0_4_ * fVar209;
              auVar224._4_4_ = fVar282 * auVar84._4_4_ * fVar209;
              auVar224._8_4_ = fVar157 * auVar84._8_4_ * fVar209;
              auVar224._12_4_ = fVar254 * auVar84._12_4_ * fVar209;
              auVar278 = ZEXT1664(auVar167);
              auVar84 = vdpps_avx(auVar86,auVar167,0x7f);
              auVar85 = vfmadd213ss_fma(auVar83,ZEXT416((uint)local_5f0._0_4_),auVar82);
              auVar83 = vdpps_avx(local_740._0_16_,auVar224,0x7f);
              vfmadd213ss_avx512f(auVar89,ZEXT416((uint)((float)local_5f0._0_4_ / fVar267)),auVar85)
              ;
              fVar280 = auVar84._0_4_ + auVar83._0_4_;
              auVar83 = vdpps_avx(local_710,auVar167,0x7f);
              auVar84 = vdpps_avx(local_740._0_16_,auVar86,0x7f);
              auVar85 = vmulss_avx512f(auVar88,ZEXT416((uint)(fVar281 * -0.5)));
              auVar86 = vmulss_avx512f(auVar88,auVar88);
              fVar281 = auVar85._0_4_ * auVar86._0_4_ + auVar90._0_4_;
              auVar85 = vdpps_avx(local_740._0_16_,local_710,0x7f);
              auVar86 = vfnmadd231ss_avx512f(auVar84,auVar87,ZEXT416((uint)fVar280));
              auVar88 = vfnmadd231ss_avx512f(auVar85,auVar87,auVar83);
              auVar84 = vpermilps_avx(local_580._0_16_,0xff);
              fVar268 = fVar268 - auVar84._0_4_;
              auVar84 = vshufps_avx(auVar16,auVar16,0xff);
              auVar85 = vfmsub213ss_fma(auVar86,ZEXT416((uint)fVar281),auVar84);
              fVar281 = auVar88._0_4_ * fVar281;
              auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar280),ZEXT416((uint)fVar281));
              fVar267 = auVar86._0_4_;
              auVar265._0_4_ = fVar281 / fVar267;
              auVar265._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar239._0_4_ = auVar85._0_4_ / fVar267;
              auVar239._4_12_ = auVar85._4_12_;
              auVar85 = vmulss_avx512f(auVar87,auVar265);
              fVar281 = auVar85._0_4_ - fVar268 * (auVar83._0_4_ / fVar267);
              auVar259 = ZEXT464((uint)fVar281);
              auVar83 = vmulss_avx512f(auVar87,auVar239);
              fVar283 = fVar283 - fVar281;
              auVar228 = ZEXT464((uint)fVar283);
              fVar279 = fVar279 - (fVar268 * (fVar280 / fVar267) - auVar83._0_4_);
              auVar289 = ZEXT464((uint)fVar279);
              auVar83 = vandps_avx512vl(auVar87,auVar275);
              auVar83 = vucomiss_avx512f(auVar83);
              bVar73 = true;
              if (!(bool)uVar72 && !(bool)uVar74) {
                auVar83 = vaddss_avx512f(auVar82,auVar83);
                auVar85 = vfmadd231ss_fma(auVar83,local_640,ZEXT416(0x36000000));
                auVar83 = vandps_avx(auVar275,ZEXT416((uint)fVar268));
                if (auVar83._0_4_ < auVar85._0_4_) {
                  fVar279 = fVar279 + (float)local_630._0_4_;
                  auVar289 = ZEXT464((uint)fVar279);
                  if ((((fVar179 <= fVar279) &&
                       (fVar280 = *(float *)(ray + k * 4 + 0x100), fVar279 <= fVar280)) &&
                      (0.0 <= fVar283)) && (fVar283 <= 1.0)) {
                    auVar51._12_4_ = 0;
                    auVar51._0_12_ = ZEXT812(0);
                    auVar83 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)local_760._0_4_));
                    fVar267 = auVar83._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar63].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar65 = true;
                      }
                      else {
                        fVar267 = fVar267 * 1.5 +
                                  local_760._0_4_ * -0.5 * fVar267 * fVar267 * fVar267;
                        auVar202._0_4_ = local_740._0_4_ * fVar267;
                        auVar202._4_4_ = local_740._4_4_ * fVar267;
                        auVar202._8_4_ = local_740._8_4_ * fVar267;
                        auVar202._12_4_ = local_740._12_4_ * fVar267;
                        auVar85 = vfmadd213ps_fma(auVar84,auVar202,auVar16);
                        auVar83 = vshufps_avx(auVar202,auVar202,0xc9);
                        auVar84 = vshufps_avx(auVar16,auVar16,0xc9);
                        auVar203._0_4_ = auVar202._0_4_ * auVar84._0_4_;
                        auVar203._4_4_ = auVar202._4_4_ * auVar84._4_4_;
                        auVar203._8_4_ = auVar202._8_4_ * auVar84._8_4_;
                        auVar203._12_4_ = auVar202._12_4_ * auVar84._12_4_;
                        auVar16 = vfmsub231ps_fma(auVar203,auVar16,auVar83);
                        auVar83 = vshufps_avx(auVar16,auVar16,0xc9);
                        auVar84 = vshufps_avx(auVar85,auVar85,0xc9);
                        auVar16 = vshufps_avx(auVar16,auVar16,0xd2);
                        auVar169._0_4_ = auVar85._0_4_ * auVar16._0_4_;
                        auVar169._4_4_ = auVar85._4_4_ * auVar16._4_4_;
                        auVar169._8_4_ = auVar85._8_4_ * auVar16._8_4_;
                        auVar169._12_4_ = auVar85._12_4_ * auVar16._12_4_;
                        auVar83 = vfmsub231ps_fma(auVar169,auVar83,auVar84);
                        auVar226._8_4_ = 1;
                        auVar226._0_8_ = 0x100000001;
                        auVar226._12_4_ = 1;
                        auVar226._16_4_ = 1;
                        auVar226._20_4_ = 1;
                        auVar226._24_4_ = 1;
                        auVar226._28_4_ = 1;
                        auVar112 = vpermps_avx2(auVar226,ZEXT1632(auVar83));
                        auVar243._8_4_ = 2;
                        auVar243._0_8_ = 0x200000002;
                        auVar243._12_4_ = 2;
                        auVar243._16_4_ = 2;
                        auVar243._20_4_ = 2;
                        auVar243._24_4_ = 2;
                        auVar243._28_4_ = 2;
                        local_3a0 = vpermps_avx2(auVar243,ZEXT1632(auVar83));
                        local_380 = auVar83._0_4_;
                        local_3c0[0] = (RTCHitN)auVar112[0];
                        local_3c0[1] = (RTCHitN)auVar112[1];
                        local_3c0[2] = (RTCHitN)auVar112[2];
                        local_3c0[3] = (RTCHitN)auVar112[3];
                        local_3c0[4] = (RTCHitN)auVar112[4];
                        local_3c0[5] = (RTCHitN)auVar112[5];
                        local_3c0[6] = (RTCHitN)auVar112[6];
                        local_3c0[7] = (RTCHitN)auVar112[7];
                        local_3c0[8] = (RTCHitN)auVar112[8];
                        local_3c0[9] = (RTCHitN)auVar112[9];
                        local_3c0[10] = (RTCHitN)auVar112[10];
                        local_3c0[0xb] = (RTCHitN)auVar112[0xb];
                        local_3c0[0xc] = (RTCHitN)auVar112[0xc];
                        local_3c0[0xd] = (RTCHitN)auVar112[0xd];
                        local_3c0[0xe] = (RTCHitN)auVar112[0xe];
                        local_3c0[0xf] = (RTCHitN)auVar112[0xf];
                        local_3c0[0x10] = (RTCHitN)auVar112[0x10];
                        local_3c0[0x11] = (RTCHitN)auVar112[0x11];
                        local_3c0[0x12] = (RTCHitN)auVar112[0x12];
                        local_3c0[0x13] = (RTCHitN)auVar112[0x13];
                        local_3c0[0x14] = (RTCHitN)auVar112[0x14];
                        local_3c0[0x15] = (RTCHitN)auVar112[0x15];
                        local_3c0[0x16] = (RTCHitN)auVar112[0x16];
                        local_3c0[0x17] = (RTCHitN)auVar112[0x17];
                        local_3c0[0x18] = (RTCHitN)auVar112[0x18];
                        local_3c0[0x19] = (RTCHitN)auVar112[0x19];
                        local_3c0[0x1a] = (RTCHitN)auVar112[0x1a];
                        local_3c0[0x1b] = (RTCHitN)auVar112[0x1b];
                        local_3c0[0x1c] = (RTCHitN)auVar112[0x1c];
                        local_3c0[0x1d] = (RTCHitN)auVar112[0x1d];
                        local_3c0[0x1e] = (RTCHitN)auVar112[0x1e];
                        local_3c0[0x1f] = (RTCHitN)auVar112[0x1f];
                        uStack_37c = local_380;
                        uStack_378 = local_380;
                        uStack_374 = local_380;
                        uStack_370 = local_380;
                        uStack_36c = local_380;
                        uStack_368 = local_380;
                        uStack_364 = local_380;
                        local_360 = fVar283;
                        fStack_35c = fVar283;
                        fStack_358 = fVar283;
                        fStack_354 = fVar283;
                        fStack_350 = fVar283;
                        fStack_34c = fVar283;
                        fStack_348 = fVar283;
                        fStack_344 = fVar283;
                        local_340 = ZEXT432(0) << 0x20;
                        local_320 = local_420._0_8_;
                        uStack_318 = local_420._8_8_;
                        uStack_310 = local_420._16_8_;
                        uStack_308 = local_420._24_8_;
                        local_300 = local_440;
                        vpcmpeqd_avx2(local_440,local_440);
                        local_2e0 = context->user->instID[0];
                        uStack_2dc = local_2e0;
                        uStack_2d8 = local_2e0;
                        uStack_2d4 = local_2e0;
                        uStack_2d0 = local_2e0;
                        uStack_2cc = local_2e0;
                        uStack_2c8 = local_2e0;
                        uStack_2c4 = local_2e0;
                        local_2c0 = context->user->instPrimID[0];
                        uStack_2bc = local_2c0;
                        uStack_2b8 = local_2c0;
                        uStack_2b4 = local_2c0;
                        uStack_2b0 = local_2c0;
                        uStack_2ac = local_2c0;
                        uStack_2a8 = local_2c0;
                        uStack_2a4 = local_2c0;
                        *(float *)(ray + k * 4 + 0x100) = fVar279;
                        local_680 = local_460._0_8_;
                        uStack_678 = local_460._8_8_;
                        uStack_670 = local_460._16_8_;
                        uStack_668 = local_460._24_8_;
                        local_7d0.valid = (int *)&local_680;
                        local_7d0.geometryUserPtr = pGVar4->userPtr;
                        local_7d0.context = context->user;
                        local_7d0.hit = local_3c0;
                        local_7d0.N = 8;
                        local_7d0.ray = (RTCRayN *)ray;
                        if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar259 = ZEXT464((uint)fVar281);
                          auVar276 = ZEXT1664(auVar275);
                          auVar278 = ZEXT1664(auVar167);
                          auVar292 = ZEXT1664(local_740._0_16_);
                          (*pGVar4->occlusionFilterN)(&local_7d0);
                          auVar289 = ZEXT1664(ZEXT416((uint)fVar279));
                          auVar228 = ZEXT1664(ZEXT416((uint)fVar283));
                          auVar297 = ZEXT3264(local_7a0);
                          auVar284 = ZEXT3264(_local_780);
                        }
                        auVar54._8_8_ = uStack_678;
                        auVar54._0_8_ = local_680;
                        auVar54._16_8_ = uStack_670;
                        auVar54._24_8_ = uStack_668;
                        if (auVar54 == (undefined1  [32])0x0) {
                          bVar65 = false;
                        }
                        else {
                          p_Var8 = context->args->filter;
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar259 = ZEXT1664(auVar259._0_16_);
                            auVar276 = ZEXT1664(auVar276._0_16_);
                            auVar278 = ZEXT1664(auVar278._0_16_);
                            auVar292 = ZEXT1664(auVar292._0_16_);
                            (*p_Var8)(&local_7d0);
                            auVar289 = ZEXT1664(ZEXT416((uint)fVar279));
                            auVar228 = ZEXT1664(ZEXT416((uint)fVar283));
                            auVar297 = ZEXT3264(local_7a0);
                            auVar284 = ZEXT3264(_local_780);
                          }
                          auVar55._8_8_ = uStack_678;
                          auVar55._0_8_ = local_680;
                          auVar55._16_8_ = uStack_670;
                          auVar55._24_8_ = uStack_668;
                          uVar75 = vptestmd_avx512vl(auVar55,auVar55);
                          auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar73 = (bool)((byte)uVar75 & 1);
                          auVar146._0_4_ =
                               (uint)bVar73 * auVar112._0_4_ |
                               (uint)!bVar73 * *(int *)(local_7d0.ray + 0x100);
                          bVar73 = (bool)((byte)(uVar75 >> 1) & 1);
                          auVar146._4_4_ =
                               (uint)bVar73 * auVar112._4_4_ |
                               (uint)!bVar73 * *(int *)(local_7d0.ray + 0x104);
                          bVar73 = (bool)((byte)(uVar75 >> 2) & 1);
                          auVar146._8_4_ =
                               (uint)bVar73 * auVar112._8_4_ |
                               (uint)!bVar73 * *(int *)(local_7d0.ray + 0x108);
                          bVar73 = (bool)((byte)(uVar75 >> 3) & 1);
                          auVar146._12_4_ =
                               (uint)bVar73 * auVar112._12_4_ |
                               (uint)!bVar73 * *(int *)(local_7d0.ray + 0x10c);
                          bVar73 = (bool)((byte)(uVar75 >> 4) & 1);
                          auVar146._16_4_ =
                               (uint)bVar73 * auVar112._16_4_ |
                               (uint)!bVar73 * *(int *)(local_7d0.ray + 0x110);
                          bVar73 = (bool)((byte)(uVar75 >> 5) & 1);
                          auVar146._20_4_ =
                               (uint)bVar73 * auVar112._20_4_ |
                               (uint)!bVar73 * *(int *)(local_7d0.ray + 0x114);
                          bVar73 = (bool)((byte)(uVar75 >> 6) & 1);
                          auVar146._24_4_ =
                               (uint)bVar73 * auVar112._24_4_ |
                               (uint)!bVar73 * *(int *)(local_7d0.ray + 0x118);
                          bVar73 = SUB81(uVar75 >> 7,0);
                          auVar146._28_4_ =
                               (uint)bVar73 * auVar112._28_4_ |
                               (uint)!bVar73 * *(int *)(local_7d0.ray + 0x11c);
                          *(undefined1 (*) [32])(local_7d0.ray + 0x100) = auVar146;
                          bVar65 = auVar55 != (undefined1  [32])0x0;
                        }
                        if ((bool)bVar65 == false) {
                          *(float *)(ray + k * 4 + 0x100) = fVar280;
                        }
                      }
                      bVar73 = false;
                      goto LAB_01c3d96e;
                    }
                  }
                  bVar73 = false;
                  bVar65 = 0;
                }
              }
LAB_01c3d96e:
              if (!bVar73) goto LAB_01c3dd65;
              lVar71 = lVar71 + -1;
            } while (lVar71 != 0);
            bVar65 = 0;
LAB_01c3dd65:
            bVar67 = bVar67 | bVar65 & 1;
            auVar57._4_4_ = fStack_4dc;
            auVar57._0_4_ = local_4e0;
            auVar57._8_4_ = fStack_4d8;
            auVar57._12_4_ = fStack_4d4;
            auVar57._16_4_ = fStack_4d0;
            auVar57._20_4_ = fStack_4cc;
            auVar57._24_4_ = fStack_4c8;
            auVar57._28_4_ = fStack_4c4;
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar37._4_4_ = uVar2;
            auVar37._0_4_ = uVar2;
            auVar37._8_4_ = uVar2;
            auVar37._12_4_ = uVar2;
            auVar37._16_4_ = uVar2;
            auVar37._20_4_ = uVar2;
            auVar37._24_4_ = uVar2;
            auVar37._28_4_ = uVar2;
            uVar17 = vcmpps_avx512vl(auVar57,auVar37,2);
            bVar66 = bVar68 & bVar66 & (byte)uVar17;
          } while (bVar66 != 0);
        }
        uVar18 = vpcmpd_avx512vl(local_400,_local_500,1);
        uVar19 = vpcmpd_avx512vl(local_400,local_260,1);
        auVar204._0_4_ = auVar284._0_4_ + (float)local_1c0._0_4_;
        auVar204._4_4_ = auVar284._4_4_ + (float)local_1c0._4_4_;
        auVar204._8_4_ = auVar284._8_4_ + fStack_1b8;
        auVar204._12_4_ = auVar284._12_4_ + fStack_1b4;
        auVar204._16_4_ = auVar284._16_4_ + fStack_1b0;
        auVar204._20_4_ = auVar284._20_4_ + fStack_1ac;
        auVar204._24_4_ = auVar284._24_4_ + fStack_1a8;
        auVar204._28_4_ = auVar284._28_4_ + fStack_1a4;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar227._4_4_ = uVar2;
        auVar227._0_4_ = uVar2;
        auVar227._8_4_ = uVar2;
        auVar227._12_4_ = uVar2;
        auVar227._16_4_ = uVar2;
        auVar227._20_4_ = uVar2;
        auVar227._24_4_ = uVar2;
        auVar227._28_4_ = uVar2;
        uVar17 = vcmpps_avx512vl(auVar204,auVar227,2);
        bVar61 = bVar61 & (byte)uVar19 & (byte)uVar17;
        auVar244._0_4_ = auVar284._0_4_ + (float)local_2a0._0_4_;
        auVar244._4_4_ = auVar284._4_4_ + (float)local_2a0._4_4_;
        auVar244._8_4_ = auVar284._8_4_ + fStack_298;
        auVar244._12_4_ = auVar284._12_4_ + fStack_294;
        auVar244._16_4_ = auVar284._16_4_ + fStack_290;
        auVar244._20_4_ = auVar284._20_4_ + fStack_28c;
        auVar244._24_4_ = auVar284._24_4_ + fStack_288;
        auVar244._28_4_ = auVar284._28_4_ + fStack_284;
        uVar17 = vcmpps_avx512vl(auVar244,auVar227,2);
        bVar59 = bVar59 & (byte)uVar18 & (byte)uVar17 | bVar61;
        if (bVar59 == 0) {
          auVar245 = ZEXT3264(_DAT_02020f20);
          auVar228 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
        }
        else {
          abStack_180[uVar62 * 0x60] = bVar59;
          auVar147._0_4_ =
               (uint)(bVar61 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar61 & 1) * local_2a0._0_4_;
          bVar73 = (bool)(bVar61 >> 1 & 1);
          auVar147._4_4_ = (uint)bVar73 * local_1c0._4_4_ | (uint)!bVar73 * local_2a0._4_4_;
          bVar73 = (bool)(bVar61 >> 2 & 1);
          auVar147._8_4_ = (uint)bVar73 * (int)fStack_1b8 | (uint)!bVar73 * (int)fStack_298;
          bVar73 = (bool)(bVar61 >> 3 & 1);
          auVar147._12_4_ = (uint)bVar73 * (int)fStack_1b4 | (uint)!bVar73 * (int)fStack_294;
          bVar73 = (bool)(bVar61 >> 4 & 1);
          auVar147._16_4_ = (uint)bVar73 * (int)fStack_1b0 | (uint)!bVar73 * (int)fStack_290;
          bVar73 = (bool)(bVar61 >> 5 & 1);
          auVar147._20_4_ = (uint)bVar73 * (int)fStack_1ac | (uint)!bVar73 * (int)fStack_28c;
          auVar147._24_4_ =
               (uint)(bVar61 >> 6) * (int)fStack_1a8 | (uint)!(bool)(bVar61 >> 6) * (int)fStack_288;
          auVar147._28_4_ = fStack_284;
          *(undefined1 (*) [32])(auStack_160 + uVar62 * 0x60) = auVar147;
          uVar17 = vmovlps_avx(local_650);
          *(undefined8 *)(afStack_140 + uVar62 * 0x18) = uVar17;
          aiStack_138[uVar62 * 0x18] = iVar69 + 1;
          auVar245 = ZEXT3264(_DAT_02020f20);
          auVar228 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          uVar62 = (ulong)((int)uVar62 + 1);
        }
      }
    }
    do {
      if ((int)uVar62 == 0) {
        if (bVar67 != 0) {
          return local_a91;
        }
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar28._4_4_ = uVar2;
        auVar28._0_4_ = uVar2;
        auVar28._8_4_ = uVar2;
        auVar28._12_4_ = uVar2;
        uVar17 = vcmpps_avx512vl(local_470,auVar28,2);
        uVar63 = (uint)uVar17 & (uint)local_5a8 - 1 & (uint)local_5a8;
        local_5a8 = (ulong)uVar63;
        local_a91 = uVar63 != 0;
        if (!local_a91) {
          return local_a91;
        }
        goto LAB_01c3b5ac;
      }
      uVar64 = (ulong)((int)uVar62 - 1);
      lVar71 = uVar64 * 0x60;
      auVar112 = *(undefined1 (*) [32])(auStack_160 + lVar71);
      auVar205._0_4_ = auVar284._0_4_ + auVar112._0_4_;
      auVar205._4_4_ = auVar284._4_4_ + auVar112._4_4_;
      auVar205._8_4_ = auVar284._8_4_ + auVar112._8_4_;
      auVar205._12_4_ = auVar284._12_4_ + auVar112._12_4_;
      auVar205._16_4_ = auVar284._16_4_ + auVar112._16_4_;
      auVar205._20_4_ = auVar284._20_4_ + auVar112._20_4_;
      auVar205._24_4_ = auVar284._24_4_ + auVar112._24_4_;
      auVar205._28_4_ = auVar284._28_4_ + auVar112._28_4_;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar38._4_4_ = uVar2;
      auVar38._0_4_ = uVar2;
      auVar38._8_4_ = uVar2;
      auVar38._12_4_ = uVar2;
      auVar38._16_4_ = uVar2;
      auVar38._20_4_ = uVar2;
      auVar38._24_4_ = uVar2;
      auVar38._28_4_ = uVar2;
      uVar17 = vcmpps_avx512vl(auVar205,auVar38,2);
      uVar76 = (uint)uVar17 & (uint)abStack_180[lVar71];
      bVar59 = (byte)uVar76;
      uVar75 = uVar64;
      if (uVar76 != 0) {
        auVar206._8_4_ = 0x7f800000;
        auVar206._0_8_ = 0x7f8000007f800000;
        auVar206._12_4_ = 0x7f800000;
        auVar206._16_4_ = 0x7f800000;
        auVar206._20_4_ = 0x7f800000;
        auVar206._24_4_ = 0x7f800000;
        auVar206._28_4_ = 0x7f800000;
        auVar104 = vblendmps_avx512vl(auVar206,auVar112);
        auVar148._0_4_ =
             (uint)(bVar59 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar59 & 1) * (int)auVar112._0_4_;
        bVar73 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar148._4_4_ = (uint)bVar73 * auVar104._4_4_ | (uint)!bVar73 * (int)auVar112._4_4_;
        bVar73 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar148._8_4_ = (uint)bVar73 * auVar104._8_4_ | (uint)!bVar73 * (int)auVar112._8_4_;
        bVar73 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar148._12_4_ = (uint)bVar73 * auVar104._12_4_ | (uint)!bVar73 * (int)auVar112._12_4_;
        bVar73 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar148._16_4_ = (uint)bVar73 * auVar104._16_4_ | (uint)!bVar73 * (int)auVar112._16_4_;
        bVar73 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar148._20_4_ = (uint)bVar73 * auVar104._20_4_ | (uint)!bVar73 * (int)auVar112._20_4_;
        bVar73 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar148._24_4_ = (uint)bVar73 * auVar104._24_4_ | (uint)!bVar73 * (int)auVar112._24_4_;
        auVar148._28_4_ =
             (uVar76 >> 7) * auVar104._28_4_ | (uint)!SUB41(uVar76 >> 7,0) * (int)auVar112._28_4_;
        auVar112 = vshufps_avx(auVar148,auVar148,0xb1);
        auVar112 = vminps_avx(auVar148,auVar112);
        auVar104 = vshufpd_avx(auVar112,auVar112,5);
        auVar112 = vminps_avx(auVar112,auVar104);
        auVar104 = vpermpd_avx2(auVar112,0x4e);
        auVar112 = vminps_avx(auVar112,auVar104);
        uVar17 = vcmpps_avx512vl(auVar148,auVar112,0);
        bVar66 = (byte)uVar17 & bVar59;
        if (bVar66 != 0) {
          uVar76 = (uint)bVar66;
        }
        fVar277 = afStack_140[uVar64 * 0x18 + 1];
        uVar149 = 0;
        for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
          uVar149 = uVar149 + 1;
        }
        iVar69 = aiStack_138[uVar64 * 0x18];
        bVar66 = ~('\x01' << ((byte)uVar149 & 0x1f)) & bVar59;
        abStack_180[lVar71] = bVar66;
        auVar228 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        if (bVar66 != 0) {
          uVar75 = uVar62;
        }
        fVar279 = afStack_140[uVar64 * 0x18];
        auVar207._4_4_ = fVar279;
        auVar207._0_4_ = fVar279;
        auVar207._8_4_ = fVar279;
        auVar207._12_4_ = fVar279;
        auVar207._16_4_ = fVar279;
        auVar207._20_4_ = fVar279;
        auVar207._24_4_ = fVar279;
        auVar207._28_4_ = fVar279;
        fVar277 = fVar277 - fVar279;
        auVar178._4_4_ = fVar277;
        auVar178._0_4_ = fVar277;
        auVar178._8_4_ = fVar277;
        auVar178._12_4_ = fVar277;
        auVar178._16_4_ = fVar277;
        auVar178._20_4_ = fVar277;
        auVar178._24_4_ = fVar277;
        auVar178._28_4_ = fVar277;
        auVar83 = vfmadd132ps_fma(auVar178,auVar207,auVar245._0_32_);
        auVar112 = ZEXT1632(auVar83);
        local_3c0[0] = (RTCHitN)auVar112[0];
        local_3c0[1] = (RTCHitN)auVar112[1];
        local_3c0[2] = (RTCHitN)auVar112[2];
        local_3c0[3] = (RTCHitN)auVar112[3];
        local_3c0[4] = (RTCHitN)auVar112[4];
        local_3c0[5] = (RTCHitN)auVar112[5];
        local_3c0[6] = (RTCHitN)auVar112[6];
        local_3c0[7] = (RTCHitN)auVar112[7];
        local_3c0[8] = (RTCHitN)auVar112[8];
        local_3c0[9] = (RTCHitN)auVar112[9];
        local_3c0[10] = (RTCHitN)auVar112[10];
        local_3c0[0xb] = (RTCHitN)auVar112[0xb];
        local_3c0[0xc] = (RTCHitN)auVar112[0xc];
        local_3c0[0xd] = (RTCHitN)auVar112[0xd];
        local_3c0[0xe] = (RTCHitN)auVar112[0xe];
        local_3c0[0xf] = (RTCHitN)auVar112[0xf];
        local_3c0[0x10] = (RTCHitN)auVar112[0x10];
        local_3c0[0x11] = (RTCHitN)auVar112[0x11];
        local_3c0[0x12] = (RTCHitN)auVar112[0x12];
        local_3c0[0x13] = (RTCHitN)auVar112[0x13];
        local_3c0[0x14] = (RTCHitN)auVar112[0x14];
        local_3c0[0x15] = (RTCHitN)auVar112[0x15];
        local_3c0[0x16] = (RTCHitN)auVar112[0x16];
        local_3c0[0x17] = (RTCHitN)auVar112[0x17];
        local_3c0[0x18] = (RTCHitN)auVar112[0x18];
        local_3c0[0x19] = (RTCHitN)auVar112[0x19];
        local_3c0[0x1a] = (RTCHitN)auVar112[0x1a];
        local_3c0[0x1b] = (RTCHitN)auVar112[0x1b];
        local_3c0[0x1c] = (RTCHitN)auVar112[0x1c];
        local_3c0[0x1d] = (RTCHitN)auVar112[0x1d];
        local_3c0[0x1e] = (RTCHitN)auVar112[0x1e];
        local_3c0[0x1f] = (RTCHitN)auVar112[0x1f];
        local_650._8_8_ = 0;
        local_650._0_8_ = *(ulong *)(local_3c0 + (ulong)uVar149 * 4);
      }
      uVar62 = uVar75;
    } while (bVar59 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }